

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_fast.c
# Opt level: O1

size_t ZSTD_compressBlock_fast
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  BYTE *pBVar3;
  BYTE *pBVar4;
  ulong *puVar5;
  undefined8 *puVar6;
  U32 *pUVar7;
  BYTE *pBVar8;
  BYTE *pBVar9;
  seqDef *psVar10;
  undefined8 uVar11;
  BYTE *pStart;
  ulong *puVar12;
  byte bVar13;
  uint uVar14;
  uint uVar15;
  ulong *puVar16;
  ulong *puVar17;
  ulong *puVar18;
  ulong *puVar19;
  uint uVar20;
  BYTE *litEnd;
  ulong *puVar21;
  uint uVar22;
  ulong *puVar23;
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  int iVar28;
  uint uVar29;
  BYTE *pBVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  long lVar34;
  ulong uVar35;
  ulong *puVar36;
  uint uVar37;
  ulong *puVar38;
  int iVar39;
  size_t sVar40;
  uint uVar41;
  BYTE *litEnd_4;
  uint uVar42;
  U32 *hashTable;
  BYTE *litLimit_w;
  BYTE *base;
  BYTE *ilimit;
  BYTE *iend;
  BYTE *pInLoopLimit_6;
  BYTE *litLimit_w_4;
  U32 offsetSaved2;
  BYTE *litLimit_w_2;
  U32 prefixStartIndex;
  BYTE *pInLoopLimit;
  BYTE *pInLoopLimit_4;
  BYTE *litLimit_w_8;
  U32 offsetSaved1;
  BYTE *prefixStart;
  size_t stepSize;
  ulong local_110;
  ulong *local_108;
  uint local_fc;
  ulong *local_c8;
  ulong *local_b0;
  ulong *local_a8;
  BYTE *local_a0;
  ulong *local_90;
  BYTE *local_88;
  BYTE *local_80;
  ulong local_78;
  BYTE *local_68;
  ulong local_48;
  
  if (ms->dictMatchState != (ZSTD_matchState_t *)0x0) {
    __assert_fail("ms->dictMatchState == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_fast.c"
                  ,0x1ab,
                  "size_t ZSTD_compressBlock_fast(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t)"
                 );
  }
  uVar15 = (ms->cParams).minMatch;
  uVar37 = (ms->cParams).targetLength;
  pUVar7 = ms->hashTable;
  if (uVar37 < 2) {
    pBVar8 = (ms->window).base;
    puVar1 = (ulong *)((long)src + srcSize);
    iVar39 = (int)pBVar8;
    iVar28 = (int)puVar1 - iVar39;
    uVar20 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
    uVar37 = (ms->window).dictLimit;
    uVar14 = iVar28 - uVar20;
    if (iVar28 - uVar37 <= uVar20) {
      uVar14 = uVar37;
    }
    uVar42 = 0;
    if (ms->loadedDictEnd != 0) {
      uVar14 = uVar37;
    }
    pBVar30 = pBVar8 + uVar14;
    puVar38 = (ulong *)((long)src + (ulong)(pBVar30 == (BYTE *)src));
    iVar28 = (int)puVar38 - iVar39;
    uVar22 = iVar28 - uVar20;
    if (iVar28 - uVar37 <= uVar20) {
      uVar22 = uVar37;
    }
    uVar20 = *rep;
    uVar24 = rep[1];
    if (ms->loadedDictEnd != 0) {
      uVar22 = uVar37;
    }
    uVar22 = iVar28 - uVar22;
    uVar37 = uVar24;
    if (uVar22 < uVar24) {
      uVar37 = uVar42;
    }
    local_110 = (ulong)uVar37;
    if (uVar24 <= uVar22) {
      uVar24 = 0;
    }
    uVar29 = uVar20;
    if (uVar22 < uVar20) {
      uVar29 = uVar42;
    }
    uVar32 = (ulong)uVar29;
    if (uVar22 < uVar20) {
      uVar42 = uVar20;
    }
    puVar18 = (ulong *)((long)src + (srcSize - 8));
    pBVar9 = pBVar8 + 2;
    puVar21 = (ulong *)((long)src + (ulong)(pBVar30 == (BYTE *)src) + 3);
    puVar16 = (ulong *)src;
    if (uVar15 == 5) {
      if (puVar21 < puVar18) {
        uVar15 = (ms->cParams).hashLog;
        if (0x20 < uVar15) goto LAB_00790826;
        bVar13 = 0x40 - (char)uVar15;
        puVar23 = (ulong *)((long)puVar1 - 7);
        puVar5 = puVar1 + -4;
        do {
          uVar37 = (uint)local_110;
          local_a8 = puVar38 + 0x10;
          uVar35 = *puVar38 * -0x30e4432345000000 >> (bVar13 & 0x3f);
          puVar17 = (ulong *)((long)puVar38 + 1);
          uVar25 = (ulong)pUVar7[uVar35];
          uVar29 = (uint)uVar32;
          lVar34 = -uVar32;
          uVar31 = 2;
          uVar26 = (ulong)(*(long *)((long)puVar38 + 1) * -0x30e4432345000000) >> (bVar13 & 0x3f);
          puVar19 = (ulong *)((long)puVar38 + 2);
          while( true ) {
            uVar41 = (int)puVar38 - iVar39;
            uVar15 = *(uint *)((long)puVar19 + lVar34);
            pUVar7[uVar35] = uVar41;
            iVar28 = (int)puVar17;
            puVar12 = puVar19;
            puVar36 = puVar17;
            puVar2 = puVar21;
            if ((uVar29 == 0) || ((uint)*puVar19 != uVar15)) {
              if ((uint)uVar25 < uVar14) {
                uVar15 = (uint)*puVar38 ^ 1;
              }
              else {
                uVar15 = *(uint *)(pBVar8 + uVar25);
              }
              if ((uint)*puVar38 == uVar15) {
                pUVar7[uVar26] = iVar28 - iVar39;
                iVar28 = 7;
              }
              else {
                uVar15 = pUVar7[uVar26];
                uVar25 = (ulong)uVar15;
                uVar27 = *puVar19 * -0x30e4432345000000 >> (bVar13 & 0x3f);
                uVar41 = iVar28 - iVar39;
                pUVar7[uVar26] = uVar41;
                if (uVar15 < uVar14) {
                  uVar15 = (uint)*puVar17 ^ 1;
                }
                else {
                  uVar15 = *(uint *)(pBVar8 + uVar25);
                }
                if ((uint)*puVar17 == uVar15) {
                  iVar28 = 7;
                  uVar35 = uVar26;
                  uVar26 = uVar27;
                  puVar12 = puVar21;
                  puVar36 = puVar19;
                  puVar38 = puVar17;
                  if (uVar31 < 5) {
                    pUVar7[uVar27] = (int)puVar19 - iVar39;
                  }
                }
                else {
                  uVar25 = (ulong)pUVar7[uVar27];
                  uVar26 = *puVar21 * -0x30e4432345000000 >> (bVar13 & 0x3f);
                  puVar12 = (ulong *)((long)puVar19 + uVar31);
                  puVar2 = (ulong *)((long)puVar21 + uVar31);
                  iVar28 = 0;
                  uVar35 = uVar27;
                  puVar36 = puVar21;
                  puVar38 = puVar19;
                  if (local_a8 <= puVar12) {
                    uVar31 = uVar31 + 1;
                    local_a8 = local_a8 + 0x10;
                  }
                }
              }
            }
            else {
              uVar27 = (ulong)(*(char *)((long)puVar19 - 1) ==
                              *(char *)((long)puVar19 + lVar34 + -1));
              puVar38 = (ulong *)((long)puVar19 - uVar27);
              local_68 = (BYTE *)((long)puVar19 + (lVar34 - uVar27));
              local_90 = (ulong *)(uVar27 | 4);
              pUVar7[uVar26] = iVar28 - iVar39;
              iVar28 = 6;
              local_a0 = &DAT_00000001;
            }
            puVar21 = puVar2;
            puVar17 = puVar36;
            if (iVar28 != 0) break;
            puVar19 = puVar12;
            if (puVar18 <= puVar21) goto LAB_00790713;
          }
          local_a8 = (ulong *)uVar32;
          if (iVar28 != 6) {
            if (iVar28 != 7) {
              return (size_t)puVar1;
            }
            local_68 = pBVar8 + uVar25;
            uVar15 = (int)puVar38 - (int)local_68;
            local_a8 = (ulong *)(ulong)uVar15;
            if (uVar15 == 0) goto LAB_00790864;
            local_90 = (ulong *)0x4;
            local_a0 = (BYTE *)(ulong)(uVar15 + 3);
            local_110 = uVar32;
            if ((uVar14 < (uint)uVar25) && (puVar16 < puVar38)) {
              pBVar3 = pBVar8 + (uVar25 - 1);
              puVar21 = puVar38;
              while (local_68 = pBVar3, puVar38 = (ulong *)((long)puVar21 + -1),
                    *(BYTE *)puVar38 == *local_68) {
                local_90 = (ulong *)((long)local_90 + 1);
                if ((puVar38 <= puVar16) ||
                   (pBVar3 = local_68 + -1, puVar21 = puVar38, local_68 <= pBVar30))
                goto LAB_0078f17c;
              }
              local_68 = local_68 + 1;
              puVar38 = puVar21;
            }
          }
LAB_0078f17c:
          puVar21 = (ulong *)((long)puVar38 + (long)local_90);
          puVar19 = (ulong *)(local_68 + (long)local_90);
          puVar17 = puVar21;
          if (puVar21 < puVar23) {
            uVar35 = *puVar21 ^ *puVar19;
            uVar32 = 0;
            if (uVar35 != 0) {
              for (; (uVar35 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
              }
            }
            uVar32 = uVar32 >> 3 & 0x1fffffff;
            if (*puVar19 == *puVar21) {
              do {
                puVar17 = puVar17 + 1;
                puVar19 = puVar19 + 1;
                if (puVar23 <= puVar17) goto LAB_0078f1f2;
                uVar35 = *puVar17 ^ *puVar19;
                uVar32 = 0;
                if (uVar35 != 0) {
                  for (; (uVar35 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                  }
                }
                uVar32 = (long)puVar17 + ((uVar32 >> 3 & 0x1fffffff) - (long)puVar21);
              } while (*puVar19 == *puVar17);
            }
          }
          else {
LAB_0078f1f2:
            if ((puVar17 < (ulong *)((long)puVar1 - 3U)) && ((uint)*puVar19 == (uint)*puVar17)) {
              puVar17 = (ulong *)((long)puVar17 + 4);
              puVar19 = (ulong *)((long)puVar19 + 4);
            }
            if ((puVar17 < (ulong *)((long)puVar1 - 1U)) && ((short)*puVar19 == (short)*puVar17)) {
              puVar17 = (ulong *)((long)puVar17 + 2);
              puVar19 = (ulong *)((long)puVar19 + 2);
            }
            if (puVar17 < puVar1) {
              puVar17 = (ulong *)((long)puVar17 + (ulong)((char)*puVar19 == (char)*puVar17));
            }
            uVar32 = (long)puVar17 - (long)puVar21;
          }
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
          goto LAB_0079076c;
          if (0x20000 < seqStore->maxNbLit) goto LAB_007907aa;
          uVar35 = (long)puVar38 - (long)puVar16;
          puVar21 = (ulong *)seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar21 + uVar35))
          goto LAB_0079078b;
          if (puVar1 < puVar38) goto LAB_0079074d;
          if (puVar5 < puVar38) {
            ZSTD_safecopyLiterals((BYTE *)puVar21,(BYTE *)puVar16,(BYTE *)puVar38,(BYTE *)puVar5);
          }
          else {
            uVar26 = puVar16[1];
            *puVar21 = *puVar16;
            puVar21[1] = uVar26;
            if (0x10 < uVar35) {
              pBVar3 = seqStore->lit;
              if (0xffffffffffffffe0 <
                  (ulong)((long)(pBVar3 + 0x10) + (-0x10 - (long)(puVar16 + 2)))) goto LAB_007908a2;
              uVar26 = puVar16[3];
              *(ulong *)(pBVar3 + 0x10) = puVar16[2];
              *(ulong *)(pBVar3 + 0x18) = uVar26;
              if (0x20 < (long)uVar35) {
                lVar34 = 0;
                do {
                  puVar6 = (undefined8 *)((long)puVar16 + lVar34 + 0x20);
                  uVar11 = puVar6[1];
                  pBVar4 = pBVar3 + lVar34 + 0x20;
                  *(undefined8 *)pBVar4 = *puVar6;
                  *(undefined8 *)(pBVar4 + 8) = uVar11;
                  puVar6 = (undefined8 *)((long)puVar16 + lVar34 + 0x30);
                  uVar11 = puVar6[1];
                  *(undefined8 *)(pBVar4 + 0x10) = *puVar6;
                  *(undefined8 *)(pBVar4 + 0x18) = uVar11;
                  lVar34 = lVar34 + 0x20;
                } while (pBVar4 + 0x20 < pBVar3 + uVar35);
              }
            }
          }
          seqStore->lit = seqStore->lit + uVar35;
          if (0xffff < uVar35) {
            if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00790845;
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          local_90 = (ulong *)(uVar32 + (long)local_90);
          psVar10 = seqStore->sequences;
          psVar10->litLength = (U16)uVar35;
          psVar10->offBase = (U32)local_a0;
          if (local_90 < 3) goto LAB_007907c9;
          if (0xffff < (long)local_90 - 3U) {
            if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_007907e8;
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar10 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar10->mlBase = (U16)((long)local_90 - 3U);
          seqStore->sequences = psVar10 + 1;
          puVar16 = (ulong *)((long)puVar38 + (long)local_90);
          if (puVar16 <= puVar18) {
            if (pBVar9 + uVar41 <= src) goto LAB_00790883;
            pUVar7[(ulong)(*(long *)(pBVar9 + uVar41) * -0x30e4432345000000) >> (bVar13 & 0x3f)] =
                 uVar41 + 2;
            pUVar7[(ulong)(*(long *)((long)puVar16 + -2) * -0x30e4432345000000) >> (bVar13 & 0x3f)]
                 = ((int)puVar16 + -2) - iVar39;
            uVar15 = (uint)local_110;
            if ((uint)local_110 == 0) {
              local_110 = 0;
            }
            else {
              do {
                uVar35 = (ulong)local_a8;
                local_110 = (ulong)uVar15;
                uVar32 = (ulong)uVar15;
                local_a8 = (ulong *)uVar35;
                if ((uint)*puVar16 != *(uint *)((long)puVar16 - uVar32)) break;
                puVar38 = (ulong *)((long)puVar16 + 4);
                puVar17 = (ulong *)((long)puVar16 + (4 - uVar32));
                puVar21 = puVar38;
                if (puVar38 < puVar23) {
                  uVar31 = *puVar38 ^ *puVar17;
                  uVar26 = 0;
                  if (uVar31 != 0) {
                    for (; (uVar31 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                    }
                  }
                  uVar26 = uVar26 >> 3 & 0x1fffffff;
                  if (*puVar17 == *puVar38) {
                    puVar21 = (ulong *)((long)puVar16 + 0xc);
                    puVar17 = (ulong *)((long)puVar16 + (0xc - uVar32));
                    do {
                      if (puVar23 <= puVar21) goto LAB_0078f4b4;
                      uVar32 = *puVar17;
                      uVar31 = *puVar21;
                      uVar25 = uVar31 ^ uVar32;
                      uVar26 = 0;
                      if (uVar25 != 0) {
                        for (; (uVar25 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                        }
                      }
                      uVar26 = (long)puVar21 + ((uVar26 >> 3 & 0x1fffffff) - (long)puVar38);
                      puVar21 = puVar21 + 1;
                      puVar17 = puVar17 + 1;
                    } while (uVar32 == uVar31);
                  }
                }
                else {
LAB_0078f4b4:
                  if ((puVar21 < (ulong *)((long)puVar1 - 3U)) && ((uint)*puVar17 == (uint)*puVar21)
                     ) {
                    puVar21 = (ulong *)((long)puVar21 + 4);
                    puVar17 = (ulong *)((long)puVar17 + 4);
                  }
                  if ((puVar21 < (ulong *)((long)puVar1 - 1U)) &&
                     ((short)*puVar17 == (short)*puVar21)) {
                    puVar21 = (ulong *)((long)puVar21 + 2);
                    puVar17 = (ulong *)((long)puVar17 + 2);
                  }
                  if (puVar21 < puVar1) {
                    puVar21 = (ulong *)((long)puVar21 + (ulong)((char)*puVar17 == (char)*puVar21));
                  }
                  uVar26 = (long)puVar21 - (long)puVar38;
                }
                pUVar7[*puVar16 * -0x30e4432345000000 >> (bVar13 & 0x3f)] = (int)puVar16 - iVar39;
                if (seqStore->maxNbSeq <=
                    (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
                goto LAB_0079076c;
                if (0x20000 < seqStore->maxNbLit) goto LAB_007907aa;
                puVar38 = (ulong *)seqStore->lit;
                if (seqStore->litStart + seqStore->maxNbLit < puVar38) goto LAB_0079078b;
                if (puVar1 < puVar16) goto LAB_0079074d;
                if (puVar5 < puVar16) {
                  ZSTD_safecopyLiterals
                            ((BYTE *)puVar38,(BYTE *)puVar16,(BYTE *)puVar16,(BYTE *)puVar5);
                }
                else {
                  uVar32 = puVar16[1];
                  *puVar38 = *puVar16;
                  puVar38[1] = uVar32;
                }
                psVar10 = seqStore->sequences;
                psVar10->litLength = 0;
                psVar10->offBase = 1;
                if (uVar26 + 4 < 3) goto LAB_007907c9;
                if (0xffff < uVar26 + 1) {
                  if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_007907e8;
                  seqStore->longLengthType = ZSTD_llt_matchLength;
                  seqStore->longLengthPos =
                       (U32)((ulong)((long)psVar10 - (long)seqStore->sequencesStart) >> 3);
                }
                puVar16 = (ulong *)((long)puVar16 + uVar26 + 4);
                psVar10->mlBase = (U16)(uVar26 + 1);
                seqStore->sequences = psVar10 + 1;
                local_a8 = (ulong *)local_110;
                local_110 = uVar35;
                uVar15 = (uint)uVar35;
              } while (puVar16 <= puVar18);
            }
          }
          uVar29 = (uint)local_a8;
          uVar37 = (uint)local_110;
          puVar21 = (ulong *)((long)puVar16 + 3);
          uVar32 = (ulong)local_a8;
          puVar38 = puVar16;
        } while (puVar21 < puVar18);
      }
    }
    else if (uVar15 == 6) {
      if (puVar21 < puVar18) {
        uVar15 = (ms->cParams).hashLog;
        if (0x20 < uVar15) goto LAB_00790826;
        bVar13 = 0x40 - (char)uVar15;
        puVar23 = (ulong *)((long)puVar1 - 7);
        puVar5 = puVar1 + -4;
        do {
          uVar37 = (uint)local_110;
          local_108 = puVar38 + 0x10;
          uVar35 = *puVar38 * -0x30e4432340650000 >> (bVar13 & 0x3f);
          uVar25 = (ulong)pUVar7[uVar35];
          uVar29 = (uint)uVar32;
          lVar34 = -uVar32;
          uVar31 = 2;
          uVar26 = (ulong)(*(long *)((long)puVar38 + 1) * -0x30e4432340650000) >> (bVar13 & 0x3f);
          puVar17 = (ulong *)((long)puVar38 + 2);
          puVar19 = (ulong *)((long)puVar38 + 1);
          while( true ) {
            uVar41 = (int)puVar38 - iVar39;
            uVar15 = *(uint *)((long)puVar17 + lVar34);
            pUVar7[uVar35] = uVar41;
            iVar28 = (int)puVar19;
            puVar12 = puVar17;
            puVar36 = puVar19;
            puVar2 = puVar21;
            if ((uVar29 == 0) || ((uint)*puVar17 != uVar15)) {
              if ((uint)uVar25 < uVar14) {
                uVar15 = (uint)*puVar38 ^ 1;
              }
              else {
                uVar15 = *(uint *)(pBVar8 + uVar25);
              }
              if ((uint)*puVar38 == uVar15) {
                pUVar7[uVar26] = iVar28 - iVar39;
                iVar28 = 7;
              }
              else {
                uVar15 = pUVar7[uVar26];
                uVar25 = (ulong)uVar15;
                uVar27 = *puVar17 * -0x30e4432340650000 >> (bVar13 & 0x3f);
                uVar41 = iVar28 - iVar39;
                pUVar7[uVar26] = uVar41;
                if (uVar15 < uVar14) {
                  uVar15 = (uint)*puVar19 ^ 1;
                }
                else {
                  uVar15 = *(uint *)(pBVar8 + uVar25);
                }
                if ((uint)*puVar19 == uVar15) {
                  iVar28 = 7;
                  uVar35 = uVar26;
                  uVar26 = uVar27;
                  puVar12 = puVar21;
                  puVar36 = puVar17;
                  puVar38 = puVar19;
                  if (uVar31 < 5) {
                    pUVar7[uVar27] = (int)puVar17 - iVar39;
                  }
                }
                else {
                  uVar25 = (ulong)pUVar7[uVar27];
                  uVar26 = *puVar21 * -0x30e4432340650000 >> (bVar13 & 0x3f);
                  puVar12 = (ulong *)((long)puVar17 + uVar31);
                  puVar2 = (ulong *)((long)puVar21 + uVar31);
                  iVar28 = 0;
                  uVar35 = uVar27;
                  puVar36 = puVar21;
                  puVar38 = puVar17;
                  if (local_108 <= puVar12) {
                    uVar31 = uVar31 + 1;
                    local_108 = local_108 + 0x10;
                  }
                }
              }
            }
            else {
              uVar27 = (ulong)(*(char *)((long)puVar17 - 1) ==
                              *(char *)((long)puVar17 + lVar34 + -1));
              puVar38 = (ulong *)((long)puVar17 - uVar27);
              local_68 = (BYTE *)((long)puVar17 + (lVar34 - uVar27));
              local_78 = uVar27 | 4;
              pUVar7[uVar26] = iVar28 - iVar39;
              iVar28 = 6;
              local_a0 = &DAT_00000001;
            }
            puVar21 = puVar2;
            if (iVar28 != 0) break;
            puVar17 = puVar12;
            puVar19 = puVar36;
            if (puVar18 <= puVar21) goto LAB_00790713;
          }
          local_108 = (ulong *)uVar32;
          if (iVar28 != 6) {
            if (iVar28 != 7) {
              return (size_t)puVar1;
            }
            local_68 = pBVar8 + uVar25;
            uVar15 = (int)puVar38 - (int)local_68;
            local_108 = (ulong *)(ulong)uVar15;
            if (uVar15 == 0) goto LAB_00790864;
            local_78 = 4;
            local_a0 = (BYTE *)(ulong)(uVar15 + 3);
            local_110 = uVar32;
            if ((uVar14 < (uint)uVar25) && (puVar16 < puVar38)) {
              pBVar3 = pBVar8 + (uVar25 - 1);
              puVar21 = puVar38;
              while (local_68 = pBVar3, puVar38 = (ulong *)((long)puVar21 + -1),
                    *(BYTE *)puVar38 == *local_68) {
                local_78 = local_78 + 1;
                if ((puVar38 <= puVar16) ||
                   (pBVar3 = local_68 + -1, puVar21 = puVar38, local_68 <= pBVar30))
                goto LAB_0078e0ea;
              }
              local_68 = local_68 + 1;
              puVar38 = puVar21;
            }
          }
LAB_0078e0ea:
          puVar21 = (ulong *)((long)puVar38 + local_78);
          puVar17 = (ulong *)(local_68 + local_78);
          puVar19 = puVar21;
          if (puVar21 < puVar23) {
            uVar35 = *puVar21 ^ *puVar17;
            uVar32 = 0;
            if (uVar35 != 0) {
              for (; (uVar35 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
              }
            }
            uVar32 = uVar32 >> 3 & 0x1fffffff;
            if (*puVar17 == *puVar21) {
              do {
                puVar19 = puVar19 + 1;
                puVar17 = puVar17 + 1;
                if (puVar23 <= puVar19) goto LAB_0078e166;
                uVar35 = *puVar19 ^ *puVar17;
                uVar32 = 0;
                if (uVar35 != 0) {
                  for (; (uVar35 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                  }
                }
                uVar32 = (long)puVar19 + ((uVar32 >> 3 & 0x1fffffff) - (long)puVar21);
              } while (*puVar17 == *puVar19);
            }
          }
          else {
LAB_0078e166:
            if ((puVar19 < (ulong *)((long)puVar1 - 3U)) && ((uint)*puVar17 == (uint)*puVar19)) {
              puVar19 = (ulong *)((long)puVar19 + 4);
              puVar17 = (ulong *)((long)puVar17 + 4);
            }
            if ((puVar19 < (ulong *)((long)puVar1 - 1U)) && ((short)*puVar17 == (short)*puVar19)) {
              puVar19 = (ulong *)((long)puVar19 + 2);
              puVar17 = (ulong *)((long)puVar17 + 2);
            }
            if (puVar19 < puVar1) {
              puVar19 = (ulong *)((long)puVar19 + (ulong)((char)*puVar17 == (char)*puVar19));
            }
            uVar32 = (long)puVar19 - (long)puVar21;
          }
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
          goto LAB_0079076c;
          if (0x20000 < seqStore->maxNbLit) goto LAB_007907aa;
          uVar35 = (long)puVar38 - (long)puVar16;
          puVar21 = (ulong *)seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar21 + uVar35))
          goto LAB_0079078b;
          if (puVar1 < puVar38) goto LAB_0079074d;
          if (puVar5 < puVar38) {
            ZSTD_safecopyLiterals((BYTE *)puVar21,(BYTE *)puVar16,(BYTE *)puVar38,(BYTE *)puVar5);
          }
          else {
            uVar26 = puVar16[1];
            *puVar21 = *puVar16;
            puVar21[1] = uVar26;
            if (0x10 < uVar35) {
              pBVar3 = seqStore->lit;
              if (0xffffffffffffffe0 <
                  (ulong)((long)(pBVar3 + 0x10) + (-0x10 - (long)(puVar16 + 2)))) goto LAB_007908a2;
              uVar26 = puVar16[3];
              *(ulong *)(pBVar3 + 0x10) = puVar16[2];
              *(ulong *)(pBVar3 + 0x18) = uVar26;
              if (0x20 < (long)uVar35) {
                lVar34 = 0;
                do {
                  puVar6 = (undefined8 *)((long)puVar16 + lVar34 + 0x20);
                  uVar11 = puVar6[1];
                  pBVar4 = pBVar3 + lVar34 + 0x20;
                  *(undefined8 *)pBVar4 = *puVar6;
                  *(undefined8 *)(pBVar4 + 8) = uVar11;
                  puVar6 = (undefined8 *)((long)puVar16 + lVar34 + 0x30);
                  uVar11 = puVar6[1];
                  *(undefined8 *)(pBVar4 + 0x10) = *puVar6;
                  *(undefined8 *)(pBVar4 + 0x18) = uVar11;
                  lVar34 = lVar34 + 0x20;
                } while (pBVar4 + 0x20 < pBVar3 + uVar35);
              }
            }
          }
          seqStore->lit = seqStore->lit + uVar35;
          if (0xffff < uVar35) {
            if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00790845;
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          local_78 = uVar32 + local_78;
          psVar10 = seqStore->sequences;
          psVar10->litLength = (U16)uVar35;
          psVar10->offBase = (U32)local_a0;
          if (local_78 < 3) goto LAB_007907c9;
          if (0xffff < local_78 - 3) {
            if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_007907e8;
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar10 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar10->mlBase = (U16)(local_78 - 3);
          seqStore->sequences = psVar10 + 1;
          puVar16 = (ulong *)((long)puVar38 + local_78);
          if (puVar16 <= puVar18) {
            if (pBVar9 + uVar41 <= src) goto LAB_00790883;
            pUVar7[(ulong)(*(long *)(pBVar9 + uVar41) * -0x30e4432340650000) >> (bVar13 & 0x3f)] =
                 uVar41 + 2;
            pUVar7[(ulong)(*(long *)((long)puVar16 + -2) * -0x30e4432340650000) >> (bVar13 & 0x3f)]
                 = ((int)puVar16 + -2) - iVar39;
            uVar15 = (uint)local_110;
            if ((uint)local_110 == 0) {
              local_110 = 0;
            }
            else {
              do {
                uVar35 = (ulong)local_108;
                local_110 = (ulong)uVar15;
                uVar32 = (ulong)uVar15;
                local_108 = (ulong *)uVar35;
                if ((uint)*puVar16 != *(uint *)((long)puVar16 - uVar32)) break;
                puVar38 = (ulong *)((long)puVar16 + 4);
                puVar17 = (ulong *)((long)puVar16 + (4 - uVar32));
                puVar21 = puVar38;
                if (puVar38 < puVar23) {
                  uVar31 = *puVar38 ^ *puVar17;
                  uVar26 = 0;
                  if (uVar31 != 0) {
                    for (; (uVar31 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                    }
                  }
                  uVar26 = uVar26 >> 3 & 0x1fffffff;
                  if (*puVar17 == *puVar38) {
                    puVar21 = (ulong *)((long)puVar16 + 0xc);
                    puVar17 = (ulong *)((long)puVar16 + (0xc - uVar32));
                    do {
                      if (puVar23 <= puVar21) goto LAB_0078e420;
                      uVar32 = *puVar17;
                      uVar31 = *puVar21;
                      uVar25 = uVar31 ^ uVar32;
                      uVar26 = 0;
                      if (uVar25 != 0) {
                        for (; (uVar25 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                        }
                      }
                      uVar26 = (long)puVar21 + ((uVar26 >> 3 & 0x1fffffff) - (long)puVar38);
                      puVar21 = puVar21 + 1;
                      puVar17 = puVar17 + 1;
                    } while (uVar32 == uVar31);
                  }
                }
                else {
LAB_0078e420:
                  if ((puVar21 < (ulong *)((long)puVar1 - 3U)) && ((uint)*puVar17 == (uint)*puVar21)
                     ) {
                    puVar21 = (ulong *)((long)puVar21 + 4);
                    puVar17 = (ulong *)((long)puVar17 + 4);
                  }
                  if ((puVar21 < (ulong *)((long)puVar1 - 1U)) &&
                     ((short)*puVar17 == (short)*puVar21)) {
                    puVar21 = (ulong *)((long)puVar21 + 2);
                    puVar17 = (ulong *)((long)puVar17 + 2);
                  }
                  if (puVar21 < puVar1) {
                    puVar21 = (ulong *)((long)puVar21 + (ulong)((char)*puVar17 == (char)*puVar21));
                  }
                  uVar26 = (long)puVar21 - (long)puVar38;
                }
                pUVar7[*puVar16 * -0x30e4432340650000 >> (bVar13 & 0x3f)] = (int)puVar16 - iVar39;
                if (seqStore->maxNbSeq <=
                    (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
                goto LAB_0079076c;
                if (0x20000 < seqStore->maxNbLit) goto LAB_007907aa;
                puVar38 = (ulong *)seqStore->lit;
                if (seqStore->litStart + seqStore->maxNbLit < puVar38) goto LAB_0079078b;
                if (puVar1 < puVar16) goto LAB_0079074d;
                if (puVar5 < puVar16) {
                  ZSTD_safecopyLiterals
                            ((BYTE *)puVar38,(BYTE *)puVar16,(BYTE *)puVar16,(BYTE *)puVar5);
                }
                else {
                  uVar32 = puVar16[1];
                  *puVar38 = *puVar16;
                  puVar38[1] = uVar32;
                }
                psVar10 = seqStore->sequences;
                psVar10->litLength = 0;
                psVar10->offBase = 1;
                if (uVar26 + 4 < 3) goto LAB_007907c9;
                if (0xffff < uVar26 + 1) {
                  if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_007907e8;
                  seqStore->longLengthType = ZSTD_llt_matchLength;
                  seqStore->longLengthPos =
                       (U32)((ulong)((long)psVar10 - (long)seqStore->sequencesStart) >> 3);
                }
                puVar16 = (ulong *)((long)puVar16 + uVar26 + 4);
                psVar10->mlBase = (U16)(uVar26 + 1);
                seqStore->sequences = psVar10 + 1;
                local_108 = (ulong *)local_110;
                local_110 = uVar35;
                uVar15 = (uint)uVar35;
              } while (puVar16 <= puVar18);
            }
          }
          uVar29 = (uint)local_108;
          uVar37 = (uint)local_110;
          puVar21 = (ulong *)((long)puVar16 + 3);
          uVar32 = (ulong)local_108;
          puVar38 = puVar16;
        } while (puVar21 < puVar18);
      }
    }
    else if (uVar15 == 7) {
      if (puVar21 < puVar18) {
        uVar15 = (ms->cParams).hashLog;
        if (0x20 < uVar15) goto LAB_00790826;
        bVar13 = 0x40 - (char)uVar15;
        puVar23 = (ulong *)((long)puVar1 - 7);
        puVar5 = puVar1 + -4;
        do {
          uVar37 = (uint)local_110;
          local_108 = puVar38 + 0x10;
          uVar35 = *puVar38 * -0x30e44323405a9d00 >> (bVar13 & 0x3f);
          uVar25 = (ulong)pUVar7[uVar35];
          uVar29 = (uint)uVar32;
          lVar34 = -uVar32;
          uVar31 = 2;
          uVar26 = (ulong)(*(long *)((long)puVar38 + 1) * -0x30e44323405a9d00) >> (bVar13 & 0x3f);
          puVar17 = (ulong *)((long)puVar38 + 2);
          puVar19 = (ulong *)((long)puVar38 + 1);
          while( true ) {
            uVar41 = (int)puVar38 - iVar39;
            uVar15 = *(uint *)((long)puVar17 + lVar34);
            pUVar7[uVar35] = uVar41;
            iVar28 = (int)puVar19;
            puVar12 = puVar17;
            puVar36 = puVar19;
            puVar2 = puVar21;
            if ((uVar29 == 0) || ((uint)*puVar17 != uVar15)) {
              if ((uint)uVar25 < uVar14) {
                uVar15 = (uint)*puVar38 ^ 1;
              }
              else {
                uVar15 = *(uint *)(pBVar8 + uVar25);
              }
              if ((uint)*puVar38 == uVar15) {
                pUVar7[uVar26] = iVar28 - iVar39;
                iVar28 = 7;
              }
              else {
                uVar15 = pUVar7[uVar26];
                uVar25 = (ulong)uVar15;
                uVar27 = *puVar17 * -0x30e44323405a9d00 >> (bVar13 & 0x3f);
                uVar41 = iVar28 - iVar39;
                pUVar7[uVar26] = uVar41;
                if (uVar15 < uVar14) {
                  uVar15 = (uint)*puVar19 ^ 1;
                }
                else {
                  uVar15 = *(uint *)(pBVar8 + uVar25);
                }
                if ((uint)*puVar19 == uVar15) {
                  iVar28 = 7;
                  uVar35 = uVar26;
                  uVar26 = uVar27;
                  puVar12 = puVar21;
                  puVar36 = puVar17;
                  puVar38 = puVar19;
                  if (uVar31 < 5) {
                    pUVar7[uVar27] = (int)puVar17 - iVar39;
                  }
                }
                else {
                  uVar25 = (ulong)pUVar7[uVar27];
                  uVar26 = *puVar21 * -0x30e44323405a9d00 >> (bVar13 & 0x3f);
                  puVar12 = (ulong *)((long)puVar17 + uVar31);
                  puVar2 = (ulong *)((long)puVar21 + uVar31);
                  iVar28 = 0;
                  uVar35 = uVar27;
                  puVar36 = puVar21;
                  puVar38 = puVar17;
                  if (local_108 <= puVar12) {
                    uVar31 = uVar31 + 1;
                    local_108 = local_108 + 0x10;
                  }
                }
              }
            }
            else {
              uVar27 = (ulong)(*(char *)((long)puVar17 - 1) ==
                              *(char *)((long)puVar17 + lVar34 + -1));
              puVar38 = (ulong *)((long)puVar17 - uVar27);
              local_68 = (BYTE *)((long)puVar17 + (lVar34 - uVar27));
              local_78 = uVar27 | 4;
              pUVar7[uVar26] = iVar28 - iVar39;
              iVar28 = 6;
              local_a0 = &DAT_00000001;
            }
            puVar21 = puVar2;
            if (iVar28 != 0) break;
            puVar17 = puVar12;
            puVar19 = puVar36;
            if (puVar18 <= puVar21) goto LAB_00790713;
          }
          local_108 = (ulong *)uVar32;
          if (iVar28 != 6) {
            if (iVar28 != 7) {
              return (size_t)puVar1;
            }
            local_68 = pBVar8 + uVar25;
            uVar15 = (int)puVar38 - (int)local_68;
            local_108 = (ulong *)(ulong)uVar15;
            if (uVar15 == 0) goto LAB_00790864;
            local_78 = 4;
            local_a0 = (BYTE *)(ulong)(uVar15 + 3);
            local_110 = uVar32;
            if ((uVar14 < (uint)uVar25) && (puVar16 < puVar38)) {
              pBVar3 = pBVar8 + (uVar25 - 1);
              puVar21 = puVar38;
              while (local_68 = pBVar3, puVar38 = (ulong *)((long)puVar21 + -1),
                    *(BYTE *)puVar38 == *local_68) {
                local_78 = local_78 + 1;
                if ((puVar38 <= puVar16) ||
                   (pBVar3 = local_68 + -1, puVar21 = puVar38, local_68 <= pBVar30))
                goto LAB_0078d0c0;
              }
              local_68 = local_68 + 1;
              puVar38 = puVar21;
            }
          }
LAB_0078d0c0:
          puVar21 = (ulong *)((long)puVar38 + local_78);
          puVar17 = (ulong *)(local_68 + local_78);
          puVar19 = puVar21;
          if (puVar21 < puVar23) {
            uVar35 = *puVar21 ^ *puVar17;
            uVar32 = 0;
            if (uVar35 != 0) {
              for (; (uVar35 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
              }
            }
            uVar32 = uVar32 >> 3 & 0x1fffffff;
            if (*puVar17 == *puVar21) {
              do {
                puVar19 = puVar19 + 1;
                puVar17 = puVar17 + 1;
                if (puVar23 <= puVar19) goto LAB_0078d13c;
                uVar35 = *puVar19 ^ *puVar17;
                uVar32 = 0;
                if (uVar35 != 0) {
                  for (; (uVar35 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                  }
                }
                uVar32 = (long)puVar19 + ((uVar32 >> 3 & 0x1fffffff) - (long)puVar21);
              } while (*puVar17 == *puVar19);
            }
          }
          else {
LAB_0078d13c:
            if ((puVar19 < (ulong *)((long)puVar1 - 3U)) && ((uint)*puVar17 == (uint)*puVar19)) {
              puVar19 = (ulong *)((long)puVar19 + 4);
              puVar17 = (ulong *)((long)puVar17 + 4);
            }
            if ((puVar19 < (ulong *)((long)puVar1 - 1U)) && ((short)*puVar17 == (short)*puVar19)) {
              puVar19 = (ulong *)((long)puVar19 + 2);
              puVar17 = (ulong *)((long)puVar17 + 2);
            }
            if (puVar19 < puVar1) {
              puVar19 = (ulong *)((long)puVar19 + (ulong)((char)*puVar17 == (char)*puVar19));
            }
            uVar32 = (long)puVar19 - (long)puVar21;
          }
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
          goto LAB_0079076c;
          if (0x20000 < seqStore->maxNbLit) goto LAB_007907aa;
          uVar35 = (long)puVar38 - (long)puVar16;
          puVar21 = (ulong *)seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar21 + uVar35))
          goto LAB_0079078b;
          if (puVar1 < puVar38) goto LAB_0079074d;
          if (puVar5 < puVar38) {
            ZSTD_safecopyLiterals((BYTE *)puVar21,(BYTE *)puVar16,(BYTE *)puVar38,(BYTE *)puVar5);
          }
          else {
            uVar26 = puVar16[1];
            *puVar21 = *puVar16;
            puVar21[1] = uVar26;
            if (0x10 < uVar35) {
              pBVar3 = seqStore->lit;
              if (0xffffffffffffffe0 <
                  (ulong)((long)(pBVar3 + 0x10) + (-0x10 - (long)(puVar16 + 2)))) goto LAB_007908a2;
              uVar26 = puVar16[3];
              *(ulong *)(pBVar3 + 0x10) = puVar16[2];
              *(ulong *)(pBVar3 + 0x18) = uVar26;
              if (0x20 < (long)uVar35) {
                lVar34 = 0;
                do {
                  puVar6 = (undefined8 *)((long)puVar16 + lVar34 + 0x20);
                  uVar11 = puVar6[1];
                  pBVar4 = pBVar3 + lVar34 + 0x20;
                  *(undefined8 *)pBVar4 = *puVar6;
                  *(undefined8 *)(pBVar4 + 8) = uVar11;
                  puVar6 = (undefined8 *)((long)puVar16 + lVar34 + 0x30);
                  uVar11 = puVar6[1];
                  *(undefined8 *)(pBVar4 + 0x10) = *puVar6;
                  *(undefined8 *)(pBVar4 + 0x18) = uVar11;
                  lVar34 = lVar34 + 0x20;
                } while (pBVar4 + 0x20 < pBVar3 + uVar35);
              }
            }
          }
          seqStore->lit = seqStore->lit + uVar35;
          if (0xffff < uVar35) {
            if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00790845;
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          local_78 = uVar32 + local_78;
          psVar10 = seqStore->sequences;
          psVar10->litLength = (U16)uVar35;
          psVar10->offBase = (U32)local_a0;
          if (local_78 < 3) goto LAB_007907c9;
          if (0xffff < local_78 - 3) {
            if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_007907e8;
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar10 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar10->mlBase = (U16)(local_78 - 3);
          seqStore->sequences = psVar10 + 1;
          puVar16 = (ulong *)((long)puVar38 + local_78);
          if (puVar16 <= puVar18) {
            if (pBVar9 + uVar41 <= src) goto LAB_00790883;
            pUVar7[(ulong)(*(long *)(pBVar9 + uVar41) * -0x30e44323405a9d00) >> (bVar13 & 0x3f)] =
                 uVar41 + 2;
            pUVar7[(ulong)(*(long *)((long)puVar16 + -2) * -0x30e44323405a9d00) >> (bVar13 & 0x3f)]
                 = ((int)puVar16 + -2) - iVar39;
            uVar15 = (uint)local_110;
            if ((uint)local_110 == 0) {
              local_110 = 0;
            }
            else {
              do {
                uVar35 = (ulong)local_108;
                local_110 = (ulong)uVar15;
                uVar32 = (ulong)uVar15;
                local_108 = (ulong *)uVar35;
                if ((uint)*puVar16 != *(uint *)((long)puVar16 - uVar32)) break;
                puVar38 = (ulong *)((long)puVar16 + 4);
                puVar17 = (ulong *)((long)puVar16 + (4 - uVar32));
                puVar21 = puVar38;
                if (puVar38 < puVar23) {
                  uVar31 = *puVar38 ^ *puVar17;
                  uVar26 = 0;
                  if (uVar31 != 0) {
                    for (; (uVar31 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                    }
                  }
                  uVar26 = uVar26 >> 3 & 0x1fffffff;
                  if (*puVar17 == *puVar38) {
                    puVar21 = (ulong *)((long)puVar16 + 0xc);
                    puVar17 = (ulong *)((long)puVar16 + (0xc - uVar32));
                    do {
                      if (puVar23 <= puVar21) goto LAB_0078d3f6;
                      uVar32 = *puVar17;
                      uVar31 = *puVar21;
                      uVar25 = uVar31 ^ uVar32;
                      uVar26 = 0;
                      if (uVar25 != 0) {
                        for (; (uVar25 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                        }
                      }
                      uVar26 = (long)puVar21 + ((uVar26 >> 3 & 0x1fffffff) - (long)puVar38);
                      puVar21 = puVar21 + 1;
                      puVar17 = puVar17 + 1;
                    } while (uVar32 == uVar31);
                  }
                }
                else {
LAB_0078d3f6:
                  if ((puVar21 < (ulong *)((long)puVar1 - 3U)) && ((uint)*puVar17 == (uint)*puVar21)
                     ) {
                    puVar21 = (ulong *)((long)puVar21 + 4);
                    puVar17 = (ulong *)((long)puVar17 + 4);
                  }
                  if ((puVar21 < (ulong *)((long)puVar1 - 1U)) &&
                     ((short)*puVar17 == (short)*puVar21)) {
                    puVar21 = (ulong *)((long)puVar21 + 2);
                    puVar17 = (ulong *)((long)puVar17 + 2);
                  }
                  if (puVar21 < puVar1) {
                    puVar21 = (ulong *)((long)puVar21 + (ulong)((char)*puVar17 == (char)*puVar21));
                  }
                  uVar26 = (long)puVar21 - (long)puVar38;
                }
                pUVar7[*puVar16 * -0x30e44323405a9d00 >> (bVar13 & 0x3f)] = (int)puVar16 - iVar39;
                if (seqStore->maxNbSeq <=
                    (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
                goto LAB_0079076c;
                if (0x20000 < seqStore->maxNbLit) goto LAB_007907aa;
                puVar38 = (ulong *)seqStore->lit;
                if (seqStore->litStart + seqStore->maxNbLit < puVar38) goto LAB_0079078b;
                if (puVar1 < puVar16) goto LAB_0079074d;
                if (puVar5 < puVar16) {
                  ZSTD_safecopyLiterals
                            ((BYTE *)puVar38,(BYTE *)puVar16,(BYTE *)puVar16,(BYTE *)puVar5);
                }
                else {
                  uVar32 = puVar16[1];
                  *puVar38 = *puVar16;
                  puVar38[1] = uVar32;
                }
                psVar10 = seqStore->sequences;
                psVar10->litLength = 0;
                psVar10->offBase = 1;
                if (uVar26 + 4 < 3) goto LAB_007907c9;
                if (0xffff < uVar26 + 1) {
                  if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_007907e8;
                  seqStore->longLengthType = ZSTD_llt_matchLength;
                  seqStore->longLengthPos =
                       (U32)((ulong)((long)psVar10 - (long)seqStore->sequencesStart) >> 3);
                }
                puVar16 = (ulong *)((long)puVar16 + uVar26 + 4);
                psVar10->mlBase = (U16)(uVar26 + 1);
                seqStore->sequences = psVar10 + 1;
                local_108 = (ulong *)local_110;
                local_110 = uVar35;
                uVar15 = (uint)uVar35;
              } while (puVar16 <= puVar18);
            }
          }
          uVar29 = (uint)local_108;
          uVar37 = (uint)local_110;
          puVar21 = (ulong *)((long)puVar16 + 3);
          uVar32 = (ulong)local_108;
          puVar38 = puVar16;
        } while (puVar21 < puVar18);
      }
    }
    else if (puVar21 < puVar18) {
      uVar15 = (ms->cParams).hashLog;
      iVar28 = uVar15 - 0x20;
      if (0x1f < uVar15 && iVar28 != 0) goto LAB_00790826;
      bVar13 = -(char)iVar28;
      puVar23 = (ulong *)((long)puVar1 - 7);
      puVar5 = puVar1 + -4;
      do {
        uVar37 = (uint)local_110;
        local_a8 = puVar38 + 0x10;
        uVar35 = (ulong)((uint)*puVar38 * -0x61c8864f >> (bVar13 & 0x1f));
        uVar31 = (ulong)pUVar7[uVar35];
        uVar29 = (uint)uVar32;
        lVar34 = -uVar32;
        uVar25 = 2;
        uVar26 = (ulong)((uint)(*(int *)((long)puVar38 + 1) * -0x61c8864f) >> (bVar13 & 0x1f));
        puVar17 = (ulong *)((long)puVar38 + 2);
        puVar19 = (ulong *)((long)puVar38 + 1);
        while( true ) {
          uVar41 = (int)puVar38 - iVar39;
          sVar40 = (size_t)uVar41;
          uVar15 = *(uint *)((long)puVar17 + lVar34);
          pUVar7[uVar35] = uVar41;
          iVar28 = (int)puVar19;
          puVar12 = puVar17;
          puVar36 = puVar19;
          puVar2 = puVar21;
          if ((uVar29 == 0) || ((uint)*puVar17 != uVar15)) {
            if ((uint)uVar31 < uVar14) {
              uVar15 = (uint)*puVar38 ^ 1;
            }
            else {
              uVar15 = *(uint *)(pBVar8 + uVar31);
            }
            if ((uint)*puVar38 == uVar15) {
              pUVar7[uVar26] = iVar28 - iVar39;
              iVar28 = 7;
            }
            else {
              uVar15 = pUVar7[uVar26];
              uVar31 = (ulong)uVar15;
              uVar27 = (ulong)((uint)*puVar17 * -0x61c8864f >> (bVar13 & 0x1f));
              sVar40 = (size_t)(uint)(iVar28 - iVar39);
              pUVar7[uVar26] = iVar28 - iVar39;
              if (uVar15 < uVar14) {
                uVar15 = (uint)*puVar19 ^ 1;
              }
              else {
                uVar15 = *(uint *)(pBVar8 + uVar31);
              }
              if ((uint)*puVar19 == uVar15) {
                iVar28 = 7;
                puVar12 = puVar21;
                uVar35 = uVar26;
                uVar26 = uVar27;
                puVar36 = puVar17;
                puVar38 = puVar19;
                if (uVar25 < 5) {
                  pUVar7[uVar27] = (int)puVar17 - iVar39;
                }
              }
              else {
                uVar31 = (ulong)pUVar7[uVar27];
                uVar26 = (ulong)((uint)*puVar21 * -0x61c8864f >> (bVar13 & 0x1f));
                puVar12 = (ulong *)((long)puVar17 + uVar25);
                puVar2 = (ulong *)((long)puVar21 + uVar25);
                iVar28 = 0;
                uVar35 = uVar27;
                puVar36 = puVar21;
                puVar38 = puVar17;
                if (local_a8 <= puVar12) {
                  uVar25 = uVar25 + 1;
                  local_a8 = local_a8 + 0x10;
                }
              }
            }
          }
          else {
            uVar27 = (ulong)(*(char *)((long)puVar17 - 1) == *(char *)((long)puVar17 + lVar34 + -1))
            ;
            puVar38 = (ulong *)((long)puVar17 - uVar27);
            local_68 = (BYTE *)((long)puVar17 + (lVar34 - uVar27));
            local_90 = (ulong *)(uVar27 | 4);
            pUVar7[uVar26] = iVar28 - iVar39;
            iVar28 = 6;
            local_a0 = &DAT_00000001;
          }
          puVar21 = puVar2;
          if (iVar28 != 0) break;
          puVar17 = puVar12;
          puVar19 = puVar36;
          if (puVar18 <= puVar21) goto LAB_00790713;
        }
        if (iVar28 != 6) {
          if (iVar28 != 7) {
            return sVar40;
          }
          local_68 = pBVar8 + uVar31;
          uVar15 = (int)puVar38 - (int)local_68;
          uVar32 = (ulong)uVar15;
          if (uVar15 == 0) goto LAB_00790864;
          local_a0 = (BYTE *)(ulong)(uVar15 + 3);
          local_90 = (ulong *)0x4;
          uVar37 = uVar29;
          if ((uVar14 < (uint)uVar31) && (puVar16 < puVar38)) {
            pBVar3 = pBVar8 + (uVar31 - 1);
            puVar21 = puVar38;
            while (local_68 = pBVar3, puVar38 = (ulong *)((long)puVar21 + -1),
                  *(BYTE *)puVar38 == *local_68) {
              local_90 = (ulong *)((long)local_90 + 1);
              if ((puVar38 <= puVar16) ||
                 (pBVar3 = local_68 + -1, puVar21 = puVar38, local_68 <= pBVar30))
              goto LAB_00790107;
            }
            local_68 = local_68 + 1;
            puVar38 = puVar21;
          }
        }
LAB_00790107:
        puVar21 = (ulong *)((long)puVar38 + (long)local_90);
        puVar17 = (ulong *)(local_68 + (long)local_90);
        puVar19 = puVar21;
        if (puVar21 < puVar23) {
          uVar26 = *puVar21 ^ *puVar17;
          uVar35 = 0;
          if (uVar26 != 0) {
            for (; (uVar26 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
            }
          }
          uVar35 = uVar35 >> 3 & 0x1fffffff;
          if (*puVar17 == *puVar21) {
            do {
              puVar19 = puVar19 + 1;
              puVar17 = puVar17 + 1;
              if (puVar23 <= puVar19) goto LAB_0079017e;
              uVar26 = *puVar19 ^ *puVar17;
              uVar35 = 0;
              if (uVar26 != 0) {
                for (; (uVar26 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                }
              }
              uVar35 = (long)puVar19 + ((uVar35 >> 3 & 0x1fffffff) - (long)puVar21);
            } while (*puVar17 == *puVar19);
          }
        }
        else {
LAB_0079017e:
          if ((puVar19 < (ulong *)((long)puVar1 - 3U)) && ((uint)*puVar17 == (uint)*puVar19)) {
            puVar19 = (ulong *)((long)puVar19 + 4);
            puVar17 = (ulong *)((long)puVar17 + 4);
          }
          if ((puVar19 < (ulong *)((long)puVar1 - 1U)) && ((short)*puVar17 == (short)*puVar19)) {
            puVar19 = (ulong *)((long)puVar19 + 2);
            puVar17 = (ulong *)((long)puVar17 + 2);
          }
          if (puVar19 < puVar1) {
            puVar19 = (ulong *)((long)puVar19 + (ulong)((char)*puVar17 == (char)*puVar19));
          }
          uVar35 = (long)puVar19 - (long)puVar21;
        }
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
        goto LAB_0079076c;
        if (0x20000 < seqStore->maxNbLit) goto LAB_007907aa;
        uVar26 = (long)puVar38 - (long)puVar16;
        puVar21 = (ulong *)seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar21 + uVar26))
        goto LAB_0079078b;
        if (puVar1 < puVar38) goto LAB_0079074d;
        if (puVar5 < puVar38) {
          ZSTD_safecopyLiterals((BYTE *)puVar21,(BYTE *)puVar16,(BYTE *)puVar38,(BYTE *)puVar5);
        }
        else {
          uVar31 = puVar16[1];
          *puVar21 = *puVar16;
          puVar21[1] = uVar31;
          if (0x10 < uVar26) {
            pBVar3 = seqStore->lit;
            if (0xffffffffffffffe0 < (ulong)((long)(pBVar3 + 0x10) + (-0x10 - (long)(puVar16 + 2))))
            goto LAB_007908a2;
            uVar31 = puVar16[3];
            *(ulong *)(pBVar3 + 0x10) = puVar16[2];
            *(ulong *)(pBVar3 + 0x18) = uVar31;
            if (0x20 < (long)uVar26) {
              lVar34 = 0;
              do {
                puVar6 = (undefined8 *)((long)puVar16 + lVar34 + 0x20);
                uVar11 = puVar6[1];
                pBVar4 = pBVar3 + lVar34 + 0x20;
                *(undefined8 *)pBVar4 = *puVar6;
                *(undefined8 *)(pBVar4 + 8) = uVar11;
                puVar6 = (undefined8 *)((long)puVar16 + lVar34 + 0x30);
                uVar11 = puVar6[1];
                *(undefined8 *)(pBVar4 + 0x10) = *puVar6;
                *(undefined8 *)(pBVar4 + 0x18) = uVar11;
                lVar34 = lVar34 + 0x20;
              } while (pBVar4 + 0x20 < pBVar3 + uVar26);
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar26;
        if (0xffff < uVar26) {
          if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00790845;
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
        local_90 = (ulong *)(uVar35 + (long)local_90);
        psVar10 = seqStore->sequences;
        psVar10->litLength = (U16)uVar26;
        psVar10->offBase = (U32)local_a0;
        if (local_90 < 3) goto LAB_007907c9;
        if (0xffff < (long)local_90 - 3U) {
          if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_007907e8;
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar10 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar10->mlBase = (U16)((long)local_90 - 3U);
        seqStore->sequences = psVar10 + 1;
        puVar16 = (ulong *)((long)puVar38 + (long)local_90);
        if (puVar18 < puVar16) {
          local_110 = (ulong)uVar37;
        }
        else {
          if (pBVar9 + sVar40 <= src) goto LAB_00790883;
          pUVar7[(uint)(*(int *)(pBVar9 + sVar40) * -0x61c8864f) >> (bVar13 & 0x1f)] =
               (int)sVar40 + 2;
          pUVar7[(uint)(*(int *)((long)puVar16 + -2) * -0x61c8864f) >> (bVar13 & 0x1f)] =
               ((int)puVar16 + -2) - iVar39;
          if (uVar37 == 0) {
            local_110 = 0;
          }
          else {
            do {
              uVar26 = uVar32;
              local_110 = (ulong)uVar37;
              uVar35 = (ulong)uVar37;
              uVar37 = (uint)uVar26;
              uVar32 = uVar26;
              if ((uint)*puVar16 != *(uint *)((long)puVar16 - uVar35)) break;
              puVar38 = (ulong *)((long)puVar16 + 4);
              puVar17 = (ulong *)((long)puVar16 + (4 - uVar35));
              puVar21 = puVar38;
              if (puVar38 < puVar23) {
                uVar31 = *puVar38 ^ *puVar17;
                uVar32 = 0;
                if (uVar31 != 0) {
                  for (; (uVar31 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                  }
                }
                uVar32 = uVar32 >> 3 & 0x1fffffff;
                if (*puVar17 == *puVar38) {
                  puVar21 = (ulong *)((long)puVar16 + 0xc);
                  puVar17 = (ulong *)((long)puVar16 + (0xc - uVar35));
                  do {
                    if (puVar23 <= puVar21) goto LAB_00790458;
                    uVar35 = *puVar17;
                    uVar31 = *puVar21;
                    uVar25 = uVar31 ^ uVar35;
                    uVar32 = 0;
                    if (uVar25 != 0) {
                      for (; (uVar25 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                      }
                    }
                    uVar32 = (long)puVar21 + ((uVar32 >> 3 & 0x1fffffff) - (long)puVar38);
                    puVar21 = puVar21 + 1;
                    puVar17 = puVar17 + 1;
                  } while (uVar35 == uVar31);
                }
              }
              else {
LAB_00790458:
                if ((puVar21 < (ulong *)((long)puVar1 - 3U)) && ((uint)*puVar17 == (uint)*puVar21))
                {
                  puVar21 = (ulong *)((long)puVar21 + 4);
                  puVar17 = (ulong *)((long)puVar17 + 4);
                }
                if ((puVar21 < (ulong *)((long)puVar1 - 1U)) && ((short)*puVar17 == (short)*puVar21)
                   ) {
                  puVar21 = (ulong *)((long)puVar21 + 2);
                  puVar17 = (ulong *)((long)puVar17 + 2);
                }
                if (puVar21 < puVar1) {
                  puVar21 = (ulong *)((long)puVar21 + (ulong)((char)*puVar17 == (char)*puVar21));
                }
                uVar32 = (long)puVar21 - (long)puVar38;
              }
              pUVar7[(uint)*puVar16 * -0x61c8864f >> (bVar13 & 0x1f)] = (int)puVar16 - iVar39;
              if (seqStore->maxNbSeq <=
                  (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
              goto LAB_0079076c;
              if (0x20000 < seqStore->maxNbLit) goto LAB_007907aa;
              puVar38 = (ulong *)seqStore->lit;
              if (seqStore->litStart + seqStore->maxNbLit < puVar38) goto LAB_0079078b;
              if (puVar1 < puVar16) goto LAB_0079074d;
              if (puVar5 < puVar16) {
                ZSTD_safecopyLiterals
                          ((BYTE *)puVar38,(BYTE *)puVar16,(BYTE *)puVar16,(BYTE *)puVar5);
              }
              else {
                uVar35 = puVar16[1];
                *puVar38 = *puVar16;
                puVar38[1] = uVar35;
              }
              psVar10 = seqStore->sequences;
              psVar10->litLength = 0;
              psVar10->offBase = 1;
              if (uVar32 + 4 < 3) goto LAB_007907c9;
              if (0xffff < uVar32 + 1) {
                if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_007907e8;
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar10 - (long)seqStore->sequencesStart) >> 3);
              }
              puVar16 = (ulong *)((long)puVar16 + uVar32 + 4);
              psVar10->mlBase = (U16)(uVar32 + 1);
              seqStore->sequences = psVar10 + 1;
              uVar32 = local_110;
              local_110 = uVar26;
            } while (puVar16 <= puVar18);
          }
        }
        uVar29 = (uint)uVar32;
        uVar37 = (uint)local_110;
        puVar21 = (ulong *)((long)puVar16 + 3);
        puVar38 = puVar16;
      } while (puVar21 < puVar18);
    }
LAB_00790713:
    uVar15 = uVar24;
    if (uVar29 != 0) {
      uVar42 = uVar29;
      uVar15 = uVar20;
    }
    if (uVar20 <= uVar22) {
      uVar15 = uVar24;
    }
    *rep = uVar42;
    if (uVar37 != 0) {
      uVar15 = uVar37;
    }
    rep[1] = uVar15;
    return (long)puVar1 - (long)puVar16;
  }
  pBVar8 = (ms->window).base;
  puVar1 = (ulong *)((long)src + srcSize);
  iVar39 = (int)pBVar8;
  iVar28 = (int)puVar1 - iVar39;
  local_110 = CONCAT44(local_110._4_4_,uVar15);
  uVar42 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  uVar14 = (ms->window).dictLimit;
  uVar20 = iVar28 - uVar42;
  if (iVar28 - uVar14 <= uVar42) {
    uVar20 = uVar14;
  }
  if (ms->loadedDictEnd != 0) {
    uVar20 = uVar14;
  }
  pBVar30 = pBVar8 + uVar20;
  puVar38 = (ulong *)((ulong)(pBVar30 == (BYTE *)src) + (long)src);
  iVar28 = (int)puVar38 - iVar39;
  uVar22 = iVar28 - uVar42;
  if (iVar28 - uVar14 <= uVar42) {
    uVar22 = uVar14;
  }
  if (ms->loadedDictEnd != 0) {
    uVar22 = uVar14;
  }
  uVar32 = (ulong)(uVar37 + 1);
  uVar37 = *rep;
  local_fc = rep[1];
  uVar22 = iVar28 - uVar22;
  if (uVar22 < local_fc) {
    uVar14 = local_fc;
    local_fc = 0;
  }
  else {
    uVar14 = 0;
  }
  uVar42 = uVar37;
  if (uVar22 < uVar37) {
    uVar42 = 0;
  }
  puVar18 = (ulong *)(ulong)uVar42;
  puVar21 = (ulong *)((long)src + (srcSize - 8));
  uVar24 = 0;
  if (uVar22 < uVar37) {
    uVar24 = uVar37;
  }
  puVar16 = (ulong *)((long)puVar38 + uVar32);
  puVar23 = (ulong *)((long)puVar38 + uVar32 + 1);
  local_90 = (ulong *)src;
  uVar29 = uVar14;
  if (uVar15 == 5) {
    if (puVar23 < puVar21) {
      uVar15 = (ms->cParams).hashLog;
      if (0x20 < uVar15) goto LAB_00790826;
      bVar13 = 0x40 - (char)uVar15;
      puVar5 = (ulong *)((long)puVar1 - 7);
      puVar17 = puVar1 + -4;
      do {
        local_108 = puVar38 + 0x10;
        uVar26 = *puVar38 * -0x30e4432345000000 >> (bVar13 & 0x3f);
        uVar25 = (ulong)pUVar7[uVar26];
        uVar42 = (uint)puVar18;
        lVar34 = -(long)puVar18;
        uVar35 = uVar32;
        uVar31 = (ulong)(*(long *)((long)puVar38 + 1) * -0x30e4432345000000) >> (bVar13 & 0x3f);
        puVar19 = (ulong *)((long)puVar38 + 1);
        while( true ) {
          uVar41 = (int)puVar38 - iVar39;
          uVar15 = *(uint *)((long)puVar16 + lVar34);
          pUVar7[uVar26] = uVar41;
          iVar28 = (int)puVar19;
          puVar12 = puVar16;
          puVar2 = puVar23;
          if ((uVar42 == 0) || ((uint)*puVar16 != uVar15)) {
            if ((uint)uVar25 < uVar20) {
              uVar15 = (uint)*puVar38 ^ 1;
            }
            else {
              uVar15 = *(uint *)(pBVar8 + uVar25);
            }
            if ((uint)*puVar38 == uVar15) {
              pUVar7[uVar31] = iVar28 - iVar39;
              iVar28 = 7;
            }
            else {
              uVar15 = pUVar7[uVar31];
              uVar25 = (ulong)uVar15;
              uVar27 = *puVar16 * -0x30e4432345000000 >> (bVar13 & 0x3f);
              uVar41 = iVar28 - iVar39;
              pUVar7[uVar31] = uVar41;
              if (uVar15 < uVar20) {
                uVar15 = (uint)*puVar19 ^ 1;
              }
              else {
                uVar15 = *(uint *)(pBVar8 + uVar25);
              }
              if ((uint)*puVar19 == uVar15) {
                iVar28 = 7;
                puVar38 = puVar19;
                uVar26 = uVar31;
                uVar31 = uVar27;
                puVar12 = puVar23;
                puVar19 = puVar16;
                if (uVar35 < 5) {
                  pUVar7[uVar27] = (int)puVar16 - iVar39;
                }
              }
              else {
                uVar25 = (ulong)pUVar7[uVar27];
                uVar31 = *puVar23 * -0x30e4432345000000 >> (bVar13 & 0x3f);
                puVar12 = (ulong *)((long)puVar16 + uVar35);
                puVar2 = (ulong *)(uVar35 + (long)puVar23);
                iVar28 = 0;
                puVar38 = puVar16;
                uVar26 = uVar27;
                puVar19 = puVar23;
                if (local_108 <= puVar12) {
                  uVar35 = uVar35 + 1;
                  local_108 = local_108 + 0x10;
                }
              }
            }
          }
          else {
            uVar27 = (ulong)(*(char *)((long)puVar16 - 1) == *(char *)((long)puVar16 + lVar34 + -1))
            ;
            puVar38 = (ulong *)((long)puVar16 - uVar27);
            local_a0 = (BYTE *)((long)puVar16 + (lVar34 - uVar27));
            local_78 = uVar27 | 4;
            pUVar7[uVar31] = iVar28 - iVar39;
            iVar28 = 6;
            local_80 = &DAT_00000001;
          }
          puVar23 = puVar2;
          puVar16 = puVar12;
          if (iVar28 != 0) break;
          if (puVar21 <= puVar23) goto LAB_0078ede5;
        }
        if (iVar28 == 6) {
          local_110 = (ulong)local_fc;
          local_108 = puVar18;
        }
        else {
          if (iVar28 != 7) {
            return (size_t)puVar19;
          }
          local_a0 = pBVar8 + uVar25;
          uVar15 = (int)puVar38 - (int)local_a0;
          local_108 = (ulong *)(ulong)uVar15;
          if (uVar15 == 0) goto LAB_00790864;
          local_80 = (BYTE *)(ulong)(uVar15 + 3);
          local_78 = 4;
          local_110 = (ulong)puVar18;
          if ((uVar20 < (uint)uVar25) && (local_90 < puVar38)) {
            pBVar9 = pBVar8 + (uVar25 - 1);
            puVar18 = puVar38;
            while (local_a0 = pBVar9, puVar38 = (ulong *)((long)puVar18 + -1),
                  *(BYTE *)puVar38 == *local_a0) {
              local_78 = local_78 + 1;
              if ((puVar38 <= local_90) ||
                 (pBVar9 = local_a0 + -1, puVar18 = puVar38, local_a0 <= pBVar30))
              goto LAB_0078e917;
            }
            local_a0 = local_a0 + 1;
            puVar38 = puVar18;
          }
        }
LAB_0078e917:
        puVar18 = (ulong *)((long)puVar38 + local_78);
        puVar16 = (ulong *)(local_a0 + local_78);
        puVar23 = puVar18;
        if (puVar18 < puVar5) {
          uVar26 = *puVar18 ^ *puVar16;
          uVar35 = 0;
          if (uVar26 != 0) {
            for (; (uVar26 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
            }
          }
          uVar35 = uVar35 >> 3 & 0x1fffffff;
          if (*puVar16 == *puVar18) {
            do {
              puVar23 = puVar23 + 1;
              puVar16 = puVar16 + 1;
              if (puVar5 <= puVar23) goto LAB_0078e98c;
              uVar26 = *puVar23 ^ *puVar16;
              uVar35 = 0;
              if (uVar26 != 0) {
                for (; (uVar26 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                }
              }
              uVar35 = (long)puVar23 + ((uVar35 >> 3 & 0x1fffffff) - (long)puVar18);
            } while (*puVar16 == *puVar23);
          }
        }
        else {
LAB_0078e98c:
          if ((puVar23 < (ulong *)((long)puVar1 - 3U)) && ((uint)*puVar16 == (uint)*puVar23)) {
            puVar23 = (ulong *)((long)puVar23 + 4);
            puVar16 = (ulong *)((long)puVar16 + 4);
          }
          if ((puVar23 < (ulong *)((long)puVar1 - 1U)) && ((short)*puVar16 == (short)*puVar23)) {
            puVar23 = (ulong *)((long)puVar23 + 2);
            puVar16 = (ulong *)((long)puVar16 + 2);
          }
          if (puVar23 < puVar1) {
            puVar23 = (ulong *)((long)puVar23 + (ulong)((char)*puVar16 == (char)*puVar23));
          }
          uVar35 = (long)puVar23 - (long)puVar18;
        }
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
        goto LAB_0079076c;
        if (0x20000 < seqStore->maxNbLit) goto LAB_007907aa;
        uVar26 = (long)puVar38 - (long)local_90;
        puVar18 = (ulong *)seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar18 + uVar26))
        goto LAB_0079078b;
        if (puVar1 < puVar38) goto LAB_0079074d;
        if (puVar17 < puVar38) {
          ZSTD_safecopyLiterals((BYTE *)puVar18,(BYTE *)local_90,(BYTE *)puVar38,(BYTE *)puVar17);
        }
        else {
          uVar31 = local_90[1];
          *puVar18 = *local_90;
          puVar18[1] = uVar31;
          if (0x10 < uVar26) {
            pBVar9 = seqStore->lit;
            if (0xffffffffffffffe0 < (ulong)((long)(pBVar9 + 0x10) + (-0x10 - (long)(local_90 + 2)))
               ) goto LAB_007908a2;
            uVar31 = local_90[3];
            *(ulong *)(pBVar9 + 0x10) = local_90[2];
            *(ulong *)(pBVar9 + 0x18) = uVar31;
            if (0x20 < (long)uVar26) {
              lVar34 = 0;
              do {
                puVar6 = (undefined8 *)((long)local_90 + lVar34 + 0x20);
                uVar11 = puVar6[1];
                pBVar3 = pBVar9 + lVar34 + 0x20;
                *(undefined8 *)pBVar3 = *puVar6;
                *(undefined8 *)(pBVar3 + 8) = uVar11;
                puVar6 = (undefined8 *)((long)local_90 + lVar34 + 0x30);
                uVar11 = puVar6[1];
                *(undefined8 *)(pBVar3 + 0x10) = *puVar6;
                *(undefined8 *)(pBVar3 + 0x18) = uVar11;
                lVar34 = lVar34 + 0x20;
              } while (pBVar3 + 0x20 < pBVar9 + uVar26);
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar26;
        if (0xffff < uVar26) {
          if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00790845;
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
        local_78 = uVar35 + local_78;
        psVar10 = seqStore->sequences;
        psVar10->litLength = (U16)uVar26;
        psVar10->offBase = (U32)local_80;
        if (local_78 < 3) goto LAB_007907c9;
        if (0xffff < local_78 - 3) {
          if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_007907e8;
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar10 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar10->mlBase = (U16)(local_78 - 3);
        seqStore->sequences = psVar10 + 1;
        local_90 = (ulong *)((long)puVar38 + local_78);
        local_fc = (uint)local_110;
        if (local_90 <= puVar21) {
          if (pBVar8 + (ulong)uVar41 + 2 <= src) goto LAB_00790883;
          pUVar7[(ulong)(*(long *)(pBVar8 + (ulong)uVar41 + 2) * -0x30e4432345000000) >>
                 (bVar13 & 0x3f)] = uVar41 + 2;
          pUVar7[(ulong)(*(long *)((long)local_90 + -2) * -0x30e4432345000000) >> (bVar13 & 0x3f)] =
               ((int)local_90 + -2) - iVar39;
          if ((uint)local_110 == 0) {
            local_fc = 0;
          }
          else {
            do {
              uVar15 = (uint)local_108;
              uVar35 = (ulong)(uint)local_110;
              local_fc = (uint)local_110;
              if ((uint)*local_90 != *(uint *)((long)local_90 - uVar35)) break;
              puVar38 = (ulong *)((long)local_90 + 4);
              puVar16 = (ulong *)((long)local_90 + (4 - uVar35));
              puVar18 = puVar38;
              if (puVar38 < puVar5) {
                uVar31 = *puVar38 ^ *puVar16;
                uVar26 = 0;
                if (uVar31 != 0) {
                  for (; (uVar31 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                  }
                }
                uVar26 = uVar26 >> 3 & 0x1fffffff;
                if (*puVar16 == *puVar38) {
                  puVar18 = (ulong *)((long)local_90 + 0xc);
                  puVar16 = (ulong *)((long)local_90 + (0xc - uVar35));
                  do {
                    if (puVar5 <= puVar18) goto LAB_0078ec4c;
                    uVar35 = *puVar16;
                    uVar31 = *puVar18;
                    uVar25 = uVar31 ^ uVar35;
                    uVar26 = 0;
                    if (uVar25 != 0) {
                      for (; (uVar25 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                      }
                    }
                    uVar26 = (long)puVar18 + ((uVar26 >> 3 & 0x1fffffff) - (long)puVar38);
                    puVar18 = puVar18 + 1;
                    puVar16 = puVar16 + 1;
                  } while (uVar35 == uVar31);
                }
              }
              else {
LAB_0078ec4c:
                if ((puVar18 < (ulong *)((long)puVar1 - 3U)) && ((uint)*puVar16 == (uint)*puVar18))
                {
                  puVar18 = (ulong *)((long)puVar18 + 4);
                  puVar16 = (ulong *)((long)puVar16 + 4);
                }
                if ((puVar18 < (ulong *)((long)puVar1 - 1U)) && ((short)*puVar16 == (short)*puVar18)
                   ) {
                  puVar18 = (ulong *)((long)puVar18 + 2);
                  puVar16 = (ulong *)((long)puVar16 + 2);
                }
                if (puVar18 < puVar1) {
                  puVar18 = (ulong *)((long)puVar18 + (ulong)((char)*puVar16 == (char)*puVar18));
                }
                uVar26 = (long)puVar18 - (long)puVar38;
              }
              pUVar7[*local_90 * -0x30e4432345000000 >> (bVar13 & 0x3f)] = (int)local_90 - iVar39;
              if (seqStore->maxNbSeq <=
                  (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
              goto LAB_0079076c;
              if (0x20000 < seqStore->maxNbLit) goto LAB_007907aa;
              puVar38 = (ulong *)seqStore->lit;
              if (seqStore->litStart + seqStore->maxNbLit < puVar38) goto LAB_0079078b;
              if (puVar1 < local_90) goto LAB_0079074d;
              if (puVar17 < local_90) {
                ZSTD_safecopyLiterals
                          ((BYTE *)puVar38,(BYTE *)local_90,(BYTE *)local_90,(BYTE *)puVar17);
              }
              else {
                uVar35 = local_90[1];
                *puVar38 = *local_90;
                puVar38[1] = uVar35;
              }
              psVar10 = seqStore->sequences;
              psVar10->litLength = 0;
              psVar10->offBase = 1;
              if (uVar26 + 4 < 3) goto LAB_007907c9;
              if (0xffff < uVar26 + 1) {
                if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_007907e8;
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar10 - (long)seqStore->sequencesStart) >> 3);
              }
              local_90 = (ulong *)((long)local_90 + uVar26 + 4);
              psVar10->mlBase = (U16)(uVar26 + 1);
              seqStore->sequences = psVar10 + 1;
              local_108 = (ulong *)(ulong)(uint)local_110;
              local_fc = uVar15;
              local_110._0_4_ = uVar15;
            } while (local_90 <= puVar21);
          }
        }
        puVar16 = (ulong *)((long)local_90 + uVar32);
        puVar23 = (ulong *)((long)local_90 + uVar32 + 1);
        uVar42 = (uint)local_108;
        puVar18 = local_108;
        puVar38 = local_90;
      } while (puVar23 < puVar21);
    }
  }
  else {
    if (uVar15 != 6) {
      if (uVar15 == 7) {
        if (puVar23 < puVar21) {
          uVar15 = (ms->cParams).hashLog;
          if (0x20 < uVar15) {
LAB_00790826:
            __assert_fail("hBits <= 32",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x342,"size_t ZSTD_hashPtr(const void *, U32, U32)");
          }
          bVar13 = 0x40 - (char)uVar15;
          puVar5 = (ulong *)((long)puVar1 - 7);
          puVar17 = puVar1 + -4;
          do {
            local_b0 = puVar38 + 0x10;
            uVar26 = *puVar38 * -0x30e44323405a9d00 >> (bVar13 & 0x3f);
            uVar25 = (ulong)pUVar7[uVar26];
            uVar42 = (uint)puVar18;
            lVar34 = -(long)puVar18;
            uVar35 = uVar32;
            uVar31 = (ulong)(*(long *)((long)puVar38 + 1) * -0x30e44323405a9d00) >> (bVar13 & 0x3f);
            puVar19 = (ulong *)((long)puVar38 + 1);
            while( true ) {
              uVar41 = (int)puVar38 - iVar39;
              uVar15 = *(uint *)((long)puVar16 + lVar34);
              pUVar7[uVar26] = uVar41;
              iVar28 = (int)puVar19;
              puVar12 = puVar16;
              puVar36 = puVar19;
              puVar2 = puVar23;
              if ((uVar42 == 0) || ((uint)*puVar16 != uVar15)) {
                if ((uint)uVar25 < uVar20) {
                  uVar15 = (uint)*puVar38 ^ 1;
                }
                else {
                  uVar15 = *(uint *)(pBVar8 + uVar25);
                }
                if ((uint)*puVar38 == uVar15) {
                  pUVar7[uVar31] = iVar28 - iVar39;
                  iVar28 = 7;
                }
                else {
                  uVar15 = pUVar7[uVar31];
                  uVar25 = (ulong)uVar15;
                  uVar27 = *puVar16 * -0x30e44323405a9d00 >> (bVar13 & 0x3f);
                  uVar41 = iVar28 - iVar39;
                  pUVar7[uVar31] = uVar41;
                  if (uVar15 < uVar20) {
                    uVar15 = (uint)*puVar19 ^ 1;
                  }
                  else {
                    uVar15 = *(uint *)(pBVar8 + uVar25);
                  }
                  if ((uint)*puVar19 == uVar15) {
                    iVar28 = 7;
                    puVar38 = puVar19;
                    uVar26 = uVar31;
                    uVar31 = uVar27;
                    puVar12 = puVar23;
                    puVar36 = puVar16;
                    if (uVar35 < 5) {
                      pUVar7[uVar27] = (int)puVar16 - iVar39;
                    }
                  }
                  else {
                    uVar25 = (ulong)pUVar7[uVar27];
                    uVar31 = *puVar23 * -0x30e44323405a9d00 >> (bVar13 & 0x3f);
                    puVar12 = (ulong *)((long)puVar16 + uVar35);
                    puVar2 = (ulong *)(uVar35 + (long)puVar23);
                    iVar28 = 0;
                    puVar38 = puVar16;
                    uVar26 = uVar27;
                    puVar36 = puVar23;
                    if (local_b0 <= puVar12) {
                      uVar35 = uVar35 + 1;
                      local_b0 = local_b0 + 0x10;
                    }
                  }
                }
              }
              else {
                uVar27 = (ulong)(*(char *)((long)puVar16 - 1) ==
                                *(char *)((long)puVar16 + lVar34 + -1));
                puVar38 = (ulong *)((long)puVar16 - uVar27);
                local_80 = (BYTE *)((long)puVar16 + (lVar34 - uVar27));
                local_c8 = (ulong *)(uVar27 | 4);
                pUVar7[uVar31] = iVar28 - iVar39;
                iVar28 = 6;
                local_a0 = &DAT_00000001;
              }
              puVar23 = puVar2;
              puVar16 = puVar12;
              if (iVar28 != 0) break;
              puVar19 = puVar36;
              if (puVar21 <= puVar23) goto LAB_0079067c;
            }
            if (iVar28 == 6) {
              local_110 = (ulong)local_fc;
              local_b0 = puVar18;
            }
            else {
              if (iVar28 != 7) {
                return (size_t)puVar19;
              }
              local_80 = pBVar8 + uVar25;
              uVar15 = (int)puVar38 - (int)local_80;
              local_b0 = (ulong *)(ulong)uVar15;
              if (uVar15 == 0) {
LAB_00790864:
                __assert_fail("(rep_offset1)>0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_fast.c"
                              ,0x16a,
                              "size_t ZSTD_compressBlock_fast_noDict_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                             );
              }
              local_a0 = (BYTE *)(ulong)(uVar15 + 3);
              local_c8 = (ulong *)0x4;
              local_110 = (ulong)puVar18;
              if ((uVar20 < (uint)uVar25) && (local_90 < puVar38)) {
                pBVar9 = pBVar8 + (uVar25 - 1);
                puVar18 = puVar38;
                while (local_80 = pBVar9, puVar38 = (ulong *)((long)puVar18 + -1),
                      *(BYTE *)puVar38 == *local_80) {
                  local_c8 = (ulong *)((long)local_c8 + 1);
                  if ((puVar38 <= local_90) ||
                     (pBVar9 = local_80 + -1, puVar18 = puVar38, local_80 <= pBVar30))
                  goto LAB_0078c798;
                }
                local_80 = local_80 + 1;
                puVar38 = puVar18;
              }
            }
LAB_0078c798:
            puVar18 = (ulong *)((long)puVar38 + (long)local_c8);
            puVar16 = (ulong *)(local_80 + (long)local_c8);
            puVar23 = puVar18;
            if (puVar18 < puVar5) {
              uVar26 = *puVar18 ^ *puVar16;
              uVar35 = 0;
              if (uVar26 != 0) {
                for (; (uVar26 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                }
              }
              uVar35 = uVar35 >> 3 & 0x1fffffff;
              if (*puVar16 == *puVar18) {
                do {
                  puVar23 = puVar23 + 1;
                  puVar16 = puVar16 + 1;
                  if (puVar5 <= puVar23) goto LAB_0078c806;
                  uVar26 = *puVar23 ^ *puVar16;
                  uVar35 = 0;
                  if (uVar26 != 0) {
                    for (; (uVar26 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                    }
                  }
                  uVar35 = (long)puVar23 + ((uVar35 >> 3 & 0x1fffffff) - (long)puVar18);
                } while (*puVar16 == *puVar23);
              }
            }
            else {
LAB_0078c806:
              if ((puVar23 < (ulong *)((long)puVar1 - 3U)) && ((uint)*puVar16 == (uint)*puVar23)) {
                puVar23 = (ulong *)((long)puVar23 + 4);
                puVar16 = (ulong *)((long)puVar16 + 4);
              }
              if ((puVar23 < (ulong *)((long)puVar1 - 1U)) && ((short)*puVar16 == (short)*puVar23))
              {
                puVar23 = (ulong *)((long)puVar23 + 2);
                puVar16 = (ulong *)((long)puVar16 + 2);
              }
              if (puVar23 < puVar1) {
                puVar23 = (ulong *)((long)puVar23 + (ulong)((char)*puVar16 == (char)*puVar23));
              }
              uVar35 = (long)puVar23 - (long)puVar18;
            }
            if (seqStore->maxNbSeq <=
                (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
LAB_0079076c:
              __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                            ,0x29d,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (0x20000 < seqStore->maxNbLit) {
LAB_007907aa:
              __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                            ,0x29f,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            uVar26 = (long)puVar38 - (long)local_90;
            puVar18 = (ulong *)seqStore->lit;
            if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar18 + uVar26)) {
LAB_0079078b:
              __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                            ,0x2a0,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (puVar1 < puVar38) {
LAB_0079074d:
              __assert_fail("literals + litLength <= litLimit",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                            ,0x2a1,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (puVar17 < puVar38) {
              ZSTD_safecopyLiterals
                        ((BYTE *)puVar18,(BYTE *)local_90,(BYTE *)puVar38,(BYTE *)puVar17);
            }
            else {
              uVar31 = local_90[1];
              *puVar18 = *local_90;
              puVar18[1] = uVar31;
              if (0x10 < uVar26) {
                pBVar9 = seqStore->lit;
                if (0xffffffffffffffe0 <
                    (ulong)((long)(pBVar9 + 0x10) + (-0x10 - (long)(local_90 + 2)))) {
LAB_007908a2:
                  __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                                ,0xe9,
                                "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                               );
                }
                uVar31 = local_90[3];
                *(ulong *)(pBVar9 + 0x10) = local_90[2];
                *(ulong *)(pBVar9 + 0x18) = uVar31;
                if (0x20 < (long)uVar26) {
                  lVar34 = 0;
                  do {
                    puVar6 = (undefined8 *)((long)local_90 + lVar34 + 0x20);
                    uVar11 = puVar6[1];
                    pBVar3 = pBVar9 + lVar34 + 0x20;
                    *(undefined8 *)pBVar3 = *puVar6;
                    *(undefined8 *)(pBVar3 + 8) = uVar11;
                    puVar6 = (undefined8 *)((long)local_90 + lVar34 + 0x30);
                    uVar11 = puVar6[1];
                    *(undefined8 *)(pBVar3 + 0x10) = *puVar6;
                    *(undefined8 *)(pBVar3 + 0x18) = uVar11;
                    lVar34 = lVar34 + 0x20;
                  } while (pBVar3 + 0x20 < pBVar9 + uVar26);
                }
              }
            }
            seqStore->lit = seqStore->lit + uVar26;
            if (0xffff < uVar26) {
              if (seqStore->longLengthType != ZSTD_llt_none) {
LAB_00790845:
                __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                              ,0x2b2,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
            local_c8 = (ulong *)(uVar35 + (long)local_c8);
            psVar10 = seqStore->sequences;
            psVar10->litLength = (U16)uVar26;
            psVar10->offBase = (U32)local_a0;
            if (local_c8 < 3) {
LAB_007907c9:
              __assert_fail("matchLength >= MINMATCH",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                            ,700,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (0xffff < (long)local_c8 - 3U) {
              if (seqStore->longLengthType != ZSTD_llt_none) {
LAB_007907e8:
                __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                              ,0x2bf,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar10 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar10->mlBase = (U16)((long)local_c8 - 3U);
            seqStore->sequences = psVar10 + 1;
            local_90 = (ulong *)((long)puVar38 + (long)local_c8);
            puVar18 = local_b0;
            if (local_90 <= puVar21) {
              if (pBVar8 + (ulong)uVar41 + 2 <= src) {
LAB_00790883:
                __assert_fail("base+current0+2 > istart",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_fast.c"
                              ,0x181,
                              "size_t ZSTD_compressBlock_fast_noDict_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                             );
              }
              pUVar7[(ulong)(*(long *)(pBVar8 + (ulong)uVar41 + 2) * -0x30e44323405a9d00) >>
                     (bVar13 & 0x3f)] = uVar41 + 2;
              pUVar7[(ulong)(*(long *)((long)local_90 + -2) * -0x30e44323405a9d00) >>
                     (bVar13 & 0x3f)] = ((int)local_90 + -2) - iVar39;
              if ((uint)local_110 == 0) {
                local_110._0_4_ = 0;
              }
              else {
                do {
                  uVar26 = (ulong)(uint)local_110;
                  uVar35 = (ulong)(uint)local_110;
                  puVar18 = local_b0;
                  if ((uint)*local_90 != *(uint *)((long)local_90 - uVar35)) break;
                  puVar38 = (ulong *)((long)local_90 + 4);
                  puVar16 = (ulong *)((long)local_90 + (4 - uVar35));
                  puVar18 = puVar38;
                  if (puVar38 < puVar5) {
                    uVar25 = *puVar38 ^ *puVar16;
                    uVar31 = 0;
                    if (uVar25 != 0) {
                      for (; (uVar25 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                      }
                    }
                    uVar31 = uVar31 >> 3 & 0x1fffffff;
                    if (*puVar16 == *puVar38) {
                      puVar18 = (ulong *)((long)local_90 + 0xc);
                      puVar16 = (ulong *)((long)local_90 + (0xc - uVar35));
                      do {
                        if (puVar5 <= puVar18) goto LAB_0078cad5;
                        uVar35 = *puVar16;
                        uVar25 = *puVar18;
                        uVar27 = uVar25 ^ uVar35;
                        uVar31 = 0;
                        if (uVar27 != 0) {
                          for (; (uVar27 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                          }
                        }
                        uVar31 = (long)puVar18 + ((uVar31 >> 3 & 0x1fffffff) - (long)puVar38);
                        puVar18 = puVar18 + 1;
                        puVar16 = puVar16 + 1;
                      } while (uVar35 == uVar25);
                    }
                  }
                  else {
LAB_0078cad5:
                    if ((puVar18 < (ulong *)((long)puVar1 - 3U)) &&
                       ((uint)*puVar16 == (uint)*puVar18)) {
                      puVar18 = (ulong *)((long)puVar18 + 4);
                      puVar16 = (ulong *)((long)puVar16 + 4);
                    }
                    if ((puVar18 < (ulong *)((long)puVar1 - 1U)) &&
                       ((short)*puVar16 == (short)*puVar18)) {
                      puVar18 = (ulong *)((long)puVar18 + 2);
                      puVar16 = (ulong *)((long)puVar16 + 2);
                    }
                    if (puVar18 < puVar1) {
                      puVar18 = (ulong *)((long)puVar18 + (ulong)((char)*puVar16 == (char)*puVar18))
                      ;
                    }
                    uVar31 = (long)puVar18 - (long)puVar38;
                  }
                  pUVar7[*local_90 * -0x30e44323405a9d00 >> (bVar13 & 0x3f)] =
                       (int)local_90 - iVar39;
                  if (seqStore->maxNbSeq <=
                      (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
                  goto LAB_0079076c;
                  if (0x20000 < seqStore->maxNbLit) goto LAB_007907aa;
                  puVar38 = (ulong *)seqStore->lit;
                  if (seqStore->litStart + seqStore->maxNbLit < puVar38) goto LAB_0079078b;
                  if (puVar1 < local_90) goto LAB_0079074d;
                  if (puVar17 < local_90) {
                    ZSTD_safecopyLiterals
                              ((BYTE *)puVar38,(BYTE *)local_90,(BYTE *)local_90,(BYTE *)puVar17);
                  }
                  else {
                    uVar35 = local_90[1];
                    *puVar38 = *local_90;
                    puVar38[1] = uVar35;
                  }
                  local_110._0_4_ = (uint)local_b0;
                  psVar10 = seqStore->sequences;
                  psVar10->litLength = 0;
                  psVar10->offBase = 1;
                  if (uVar31 + 4 < 3) goto LAB_007907c9;
                  if (0xffff < uVar31 + 1) {
                    if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_007907e8;
                    seqStore->longLengthType = ZSTD_llt_matchLength;
                    seqStore->longLengthPos =
                         (U32)((ulong)((long)psVar10 - (long)seqStore->sequencesStart) >> 3);
                  }
                  local_90 = (ulong *)((long)local_90 + uVar31 + 4);
                  psVar10->mlBase = (U16)(uVar31 + 1);
                  seqStore->sequences = psVar10 + 1;
                  local_b0 = (ulong *)uVar26;
                  puVar18 = (ulong *)uVar26;
                } while (local_90 <= puVar21);
              }
            }
            puVar16 = (ulong *)((long)local_90 + uVar32);
            puVar23 = (ulong *)((long)local_90 + uVar32 + 1);
            uVar42 = (uint)puVar18;
            puVar38 = local_90;
            local_fc = (uint)local_110;
          } while (puVar23 < puVar21);
        }
LAB_0079067c:
        if (uVar42 != 0) {
          uVar24 = uVar42;
          uVar29 = uVar37;
        }
      }
      else {
        if (puVar23 < puVar21) {
          uVar15 = (ms->cParams).hashLog;
          iVar28 = uVar15 - 0x20;
          if (0x1f < uVar15 && iVar28 != 0) goto LAB_00790826;
          bVar13 = -(char)iVar28;
          puVar5 = (ulong *)((long)puVar1 - 7);
          puVar17 = puVar1 + -4;
          uVar35 = local_110;
          local_90 = (ulong *)src;
          do {
            local_110 = uVar35;
            local_108 = puVar38 + 0x10;
            uVar26 = (ulong)((uint)*puVar38 * -0x61c8864f >> (bVar13 & 0x1f));
            uVar27 = (ulong)pUVar7[uVar26];
            uVar42 = (uint)puVar18;
            lVar34 = -(long)puVar18;
            uVar35 = uVar32;
            uVar31 = (ulong)((uint)(*(int *)((long)puVar38 + 1) * -0x61c8864f) >> (bVar13 & 0x1f));
            puVar19 = (ulong *)((long)puVar38 + 1);
            uVar25 = local_110;
            while( true ) {
              uVar41 = (int)puVar38 - iVar39;
              uVar15 = *(uint *)((long)puVar16 + lVar34);
              pUVar7[uVar26] = uVar41;
              iVar28 = (int)puVar19;
              puVar12 = puVar16;
              puVar2 = puVar23;
              if ((uVar42 == 0) || ((uint)*puVar16 != uVar15)) {
                if ((uint)uVar27 < uVar20) {
                  uVar15 = (uint)*puVar38 ^ 1;
                }
                else {
                  uVar15 = *(uint *)(pBVar8 + uVar27);
                }
                if ((uint)*puVar38 == uVar15) {
                  pUVar7[uVar31] = iVar28 - iVar39;
                  iVar28 = 7;
                }
                else {
                  uVar15 = pUVar7[uVar31];
                  uVar27 = (ulong)uVar15;
                  uVar33 = (ulong)((uint)*puVar16 * -0x61c8864f >> (bVar13 & 0x1f));
                  uVar41 = iVar28 - iVar39;
                  pUVar7[uVar31] = uVar41;
                  if (uVar15 < uVar20) {
                    uVar15 = (uint)*puVar19 ^ 1;
                  }
                  else {
                    uVar15 = *(uint *)(pBVar8 + uVar27);
                  }
                  if ((uint)*puVar19 == uVar15) {
                    iVar28 = 7;
                    puVar12 = puVar23;
                    puVar38 = puVar19;
                    uVar26 = uVar31;
                    uVar31 = uVar33;
                    puVar19 = puVar16;
                    if (uVar35 < 5) {
                      pUVar7[uVar33] = (int)puVar16 - iVar39;
                    }
                  }
                  else {
                    uVar27 = (ulong)pUVar7[uVar33];
                    uVar31 = (ulong)((uint)*puVar23 * -0x61c8864f >> (bVar13 & 0x1f));
                    puVar12 = (ulong *)((long)puVar16 + uVar35);
                    puVar2 = (ulong *)(uVar35 + (long)puVar23);
                    iVar28 = 0;
                    puVar38 = puVar16;
                    uVar26 = uVar33;
                    puVar19 = puVar23;
                    if (local_108 <= puVar12) {
                      uVar35 = uVar35 + 1;
                      local_108 = local_108 + 0x10;
                    }
                  }
                }
              }
              else {
                uVar25 = (ulong)(*(char *)((long)puVar16 - 1) ==
                                *(char *)((long)puVar16 + lVar34 + -1));
                puVar38 = (ulong *)((long)puVar16 - uVar25);
                local_a0 = (BYTE *)((long)puVar16 + (lVar34 - uVar25));
                uVar25 = uVar25 | 4;
                pUVar7[uVar31] = iVar28 - iVar39;
                iVar28 = 6;
                local_80 = &DAT_00000001;
              }
              puVar23 = puVar2;
              puVar16 = puVar12;
              if (iVar28 != 0) break;
              if (puVar21 <= puVar23) goto LAB_007906ad;
            }
            if (iVar28 == 6) {
              local_110 = (ulong)local_fc;
              local_108 = puVar18;
            }
            else {
              if (iVar28 != 7) {
                return (size_t)puVar1;
              }
              local_a0 = pBVar8 + uVar27;
              uVar15 = (int)puVar38 - (int)local_a0;
              local_108 = (ulong *)(ulong)uVar15;
              if (uVar15 == 0) goto LAB_00790864;
              local_80 = (BYTE *)(ulong)(uVar15 + 3);
              uVar25 = 4;
              local_110 = (ulong)puVar18;
              if ((uVar20 < (uint)uVar27) && (local_90 < puVar38)) {
                pBVar9 = pBVar8 + (uVar27 - 1);
                puVar18 = puVar38;
                while (local_a0 = pBVar9, puVar38 = (ulong *)((long)puVar18 + -1),
                      *(BYTE *)puVar38 == *local_a0) {
                  uVar25 = uVar25 + 1;
                  if ((puVar38 <= local_90) ||
                     (pBVar9 = local_a0 + -1, puVar18 = puVar38, local_a0 <= pBVar30))
                  goto LAB_0078f958;
                }
                local_a0 = local_a0 + 1;
                puVar38 = puVar18;
              }
            }
LAB_0078f958:
            puVar18 = (ulong *)((long)puVar38 + uVar25);
            puVar16 = (ulong *)(local_a0 + uVar25);
            puVar23 = puVar18;
            if (puVar18 < puVar5) {
              uVar26 = *puVar18 ^ *puVar16;
              uVar35 = 0;
              if (uVar26 != 0) {
                for (; (uVar26 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                }
              }
              uVar35 = uVar35 >> 3 & 0x1fffffff;
              if (*puVar16 == *puVar18) {
                do {
                  puVar23 = puVar23 + 1;
                  puVar16 = puVar16 + 1;
                  if (puVar5 <= puVar23) goto LAB_0078f9c9;
                  uVar26 = *puVar23 ^ *puVar16;
                  uVar35 = 0;
                  if (uVar26 != 0) {
                    for (; (uVar26 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                    }
                  }
                  uVar35 = (long)puVar23 + ((uVar35 >> 3 & 0x1fffffff) - (long)puVar18);
                } while (*puVar16 == *puVar23);
              }
            }
            else {
LAB_0078f9c9:
              if ((puVar23 < (ulong *)((long)puVar1 - 3U)) && ((uint)*puVar16 == (uint)*puVar23)) {
                puVar23 = (ulong *)((long)puVar23 + 4);
                puVar16 = (ulong *)((long)puVar16 + 4);
              }
              if ((puVar23 < (ulong *)((long)puVar1 - 1U)) && ((short)*puVar16 == (short)*puVar23))
              {
                puVar23 = (ulong *)((long)puVar23 + 2);
                puVar16 = (ulong *)((long)puVar16 + 2);
              }
              if (puVar23 < puVar1) {
                puVar23 = (ulong *)((long)puVar23 + (ulong)((char)*puVar16 == (char)*puVar23));
              }
              uVar35 = (long)puVar23 - (long)puVar18;
            }
            if (seqStore->maxNbSeq <=
                (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
            goto LAB_0079076c;
            if (0x20000 < seqStore->maxNbLit) goto LAB_007907aa;
            uVar26 = (long)puVar38 - (long)local_90;
            puVar18 = (ulong *)seqStore->lit;
            if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar18 + uVar26))
            goto LAB_0079078b;
            if (puVar1 < puVar38) goto LAB_0079074d;
            if (puVar17 < puVar38) {
              ZSTD_safecopyLiterals
                        ((BYTE *)puVar18,(BYTE *)local_90,(BYTE *)puVar38,(BYTE *)puVar17);
            }
            else {
              uVar31 = local_90[1];
              *puVar18 = *local_90;
              puVar18[1] = uVar31;
              if (0x10 < uVar26) {
                pBVar9 = seqStore->lit;
                if (0xffffffffffffffe0 <
                    (ulong)((long)(pBVar9 + 0x10) + (-0x10 - (long)(local_90 + 2))))
                goto LAB_007908a2;
                uVar31 = local_90[3];
                *(ulong *)(pBVar9 + 0x10) = local_90[2];
                *(ulong *)(pBVar9 + 0x18) = uVar31;
                if (0x20 < (long)uVar26) {
                  lVar34 = 0;
                  do {
                    puVar6 = (undefined8 *)((long)local_90 + lVar34 + 0x20);
                    uVar11 = puVar6[1];
                    pBVar3 = pBVar9 + lVar34 + 0x20;
                    *(undefined8 *)pBVar3 = *puVar6;
                    *(undefined8 *)(pBVar3 + 8) = uVar11;
                    puVar6 = (undefined8 *)((long)local_90 + lVar34 + 0x30);
                    uVar11 = puVar6[1];
                    *(undefined8 *)(pBVar3 + 0x10) = *puVar6;
                    *(undefined8 *)(pBVar3 + 0x18) = uVar11;
                    lVar34 = lVar34 + 0x20;
                  } while (pBVar3 + 0x20 < pBVar9 + uVar26);
                }
              }
            }
            seqStore->lit = seqStore->lit + uVar26;
            if (0xffff < uVar26) {
              if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00790845;
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
            uVar35 = uVar35 + uVar25;
            psVar10 = seqStore->sequences;
            psVar10->litLength = (U16)uVar26;
            psVar10->offBase = (U32)local_80;
            if (uVar35 < 3) goto LAB_007907c9;
            if (0xffff < uVar35 - 3) {
              if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_007907e8;
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar10 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar10->mlBase = (U16)(uVar35 - 3);
            seqStore->sequences = psVar10 + 1;
            puVar38 = (ulong *)((long)puVar38 + uVar35);
            puVar18 = local_108;
            if (puVar38 <= puVar21) {
              if (pBVar8 + (ulong)uVar41 + 2 <= src) goto LAB_00790883;
              pUVar7[(uint)(*(int *)(pBVar8 + (ulong)uVar41 + 2) * -0x61c8864f) >> (bVar13 & 0x1f)]
                   = uVar41 + 2;
              pUVar7[(uint)(*(int *)((long)puVar38 + -2) * -0x61c8864f) >> (bVar13 & 0x1f)] =
                   ((int)puVar38 + -2) - iVar39;
              uVar26 = local_110;
              if ((uint)local_110 == 0) {
                local_110._0_4_ = 0;
              }
              else {
                do {
                  uVar31 = uVar26;
                  puVar18 = local_108;
                  if ((uint)*puVar38 != *(uint *)((long)puVar38 - uVar31)) {
                    local_110._0_4_ = (uint)uVar31;
                    break;
                  }
                  puVar16 = (ulong *)((long)puVar38 + 4);
                  puVar19 = (ulong *)((long)puVar38 + (4 - uVar31));
                  puVar23 = puVar16;
                  if (puVar16 < puVar5) {
                    uVar25 = *puVar16 ^ *puVar19;
                    uVar26 = 0;
                    if (uVar25 != 0) {
                      for (; (uVar25 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                      }
                    }
                    uVar26 = uVar26 >> 3 & 0x1fffffff;
                    if (*puVar19 == *puVar16) {
                      puVar23 = (ulong *)((long)puVar38 + 0xc);
                      puVar19 = (ulong *)((long)puVar38 + (0xc - uVar31));
                      do {
                        if (puVar5 <= puVar23) goto LAB_0078fc7c;
                        uVar25 = *puVar19;
                        uVar27 = *puVar23;
                        uVar33 = uVar27 ^ uVar25;
                        uVar26 = 0;
                        if (uVar33 != 0) {
                          for (; (uVar33 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                          }
                        }
                        uVar26 = (long)puVar23 + ((uVar26 >> 3 & 0x1fffffff) - (long)puVar16);
                        puVar23 = puVar23 + 1;
                        puVar19 = puVar19 + 1;
                      } while (uVar25 == uVar27);
                    }
                  }
                  else {
LAB_0078fc7c:
                    if ((puVar23 < (ulong *)((long)puVar1 - 3U)) &&
                       ((uint)*puVar19 == (uint)*puVar23)) {
                      puVar23 = (ulong *)((long)puVar23 + 4);
                      puVar19 = (ulong *)((long)puVar19 + 4);
                    }
                    if ((puVar23 < (ulong *)((long)puVar1 - 1U)) &&
                       ((short)*puVar19 == (short)*puVar23)) {
                      puVar23 = (ulong *)((long)puVar23 + 2);
                      puVar19 = (ulong *)((long)puVar19 + 2);
                    }
                    if (puVar23 < puVar1) {
                      puVar23 = (ulong *)((long)puVar23 + (ulong)((char)*puVar19 == (char)*puVar23))
                      ;
                    }
                    uVar26 = (long)puVar23 - (long)puVar16;
                  }
                  pUVar7[(uint)*puVar38 * -0x61c8864f >> (bVar13 & 0x1f)] = (int)puVar38 - iVar39;
                  if (seqStore->maxNbSeq <=
                      (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
                  goto LAB_0079076c;
                  if (0x20000 < seqStore->maxNbLit) goto LAB_007907aa;
                  puVar16 = (ulong *)seqStore->lit;
                  if (seqStore->litStart + seqStore->maxNbLit < puVar16) goto LAB_0079078b;
                  if (puVar1 < puVar38) goto LAB_0079074d;
                  if (puVar17 < puVar38) {
                    ZSTD_safecopyLiterals
                              ((BYTE *)puVar16,(BYTE *)puVar38,(BYTE *)puVar38,(BYTE *)puVar17);
                  }
                  else {
                    uVar25 = puVar38[1];
                    *puVar16 = *puVar38;
                    puVar16[1] = uVar25;
                  }
                  local_110._0_4_ = (uint)puVar18;
                  psVar10 = seqStore->sequences;
                  psVar10->litLength = 0;
                  psVar10->offBase = 1;
                  if (uVar26 + 4 < 3) goto LAB_007907c9;
                  if (0xffff < uVar26 + 1) {
                    if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_007907e8;
                    seqStore->longLengthType = ZSTD_llt_matchLength;
                    seqStore->longLengthPos =
                         (U32)((ulong)((long)psVar10 - (long)seqStore->sequencesStart) >> 3);
                  }
                  puVar38 = (ulong *)((long)puVar38 + uVar26 + 4);
                  psVar10->mlBase = (U16)(uVar26 + 1);
                  seqStore->sequences = psVar10 + 1;
                  local_108 = (ulong *)uVar31;
                  uVar26 = (ulong)puVar18;
                  puVar18 = (ulong *)uVar31;
                } while (puVar38 <= puVar21);
              }
            }
            puVar16 = (ulong *)((long)puVar38 + uVar32);
            puVar23 = (ulong *)((long)puVar38 + uVar32 + 1);
            uVar42 = (uint)puVar18;
            local_90 = puVar38;
            local_fc = (uint)local_110;
          } while (puVar23 < puVar21);
        }
LAB_007906ad:
        if (uVar42 != 0) {
          uVar24 = uVar42;
          uVar29 = uVar37;
        }
      }
      if (uVar37 <= uVar22) {
        uVar29 = uVar14;
      }
      *rep = uVar24;
      if (local_fc != 0) {
        uVar29 = local_fc;
      }
      goto LAB_007906e1;
    }
    if (puVar23 < puVar21) {
      uVar15 = (ms->cParams).hashLog;
      if (0x20 < uVar15) goto LAB_00790826;
      bVar13 = 0x40 - (char)uVar15;
      puVar5 = (ulong *)((long)puVar1 - 7);
      puVar17 = puVar1 + -4;
      do {
        local_c8 = puVar38 + 0x10;
        uVar26 = *puVar38 * -0x30e4432340650000 >> (bVar13 & 0x3f);
        uVar25 = (ulong)pUVar7[uVar26];
        uVar42 = (uint)puVar18;
        lVar34 = -(long)puVar18;
        uVar35 = uVar32;
        uVar31 = (ulong)(*(long *)((long)puVar38 + 1) * -0x30e4432340650000) >> (bVar13 & 0x3f);
        puVar19 = (ulong *)((long)puVar38 + 1);
        while( true ) {
          uVar41 = (int)puVar38 - iVar39;
          uVar15 = *(uint *)((long)puVar16 + lVar34);
          pUVar7[uVar26] = uVar41;
          iVar28 = (int)puVar19;
          puVar12 = puVar16;
          puVar36 = puVar19;
          puVar2 = puVar23;
          if ((uVar42 == 0) || ((uint)*puVar16 != uVar15)) {
            if ((uint)uVar25 < uVar20) {
              uVar15 = (uint)*puVar38 ^ 1;
            }
            else {
              uVar15 = *(uint *)(pBVar8 + uVar25);
            }
            if ((uint)*puVar38 == uVar15) {
              pUVar7[uVar31] = iVar28 - iVar39;
              iVar28 = 7;
            }
            else {
              uVar15 = pUVar7[uVar31];
              uVar25 = (ulong)uVar15;
              uVar27 = *puVar16 * -0x30e4432340650000 >> (bVar13 & 0x3f);
              uVar41 = iVar28 - iVar39;
              pUVar7[uVar31] = uVar41;
              if (uVar15 < uVar20) {
                uVar15 = (uint)*puVar19 ^ 1;
              }
              else {
                uVar15 = *(uint *)(pBVar8 + uVar25);
              }
              if ((uint)*puVar19 == uVar15) {
                iVar28 = 7;
                puVar38 = puVar19;
                uVar26 = uVar31;
                uVar31 = uVar27;
                puVar12 = puVar23;
                puVar36 = puVar16;
                if (uVar35 < 5) {
                  pUVar7[uVar27] = (int)puVar16 - iVar39;
                }
              }
              else {
                uVar25 = (ulong)pUVar7[uVar27];
                uVar31 = *puVar23 * -0x30e4432340650000 >> (bVar13 & 0x3f);
                puVar12 = (ulong *)((long)puVar16 + uVar35);
                puVar2 = (ulong *)(uVar35 + (long)puVar23);
                iVar28 = 0;
                puVar38 = puVar16;
                uVar26 = uVar27;
                puVar36 = puVar23;
                if (local_c8 <= puVar12) {
                  uVar35 = uVar35 + 1;
                  local_c8 = local_c8 + 0x10;
                }
              }
            }
          }
          else {
            uVar27 = (ulong)(*(char *)((long)puVar16 - 1) == *(char *)((long)puVar16 + lVar34 + -1))
            ;
            puVar38 = (ulong *)((long)puVar16 - uVar27);
            local_88 = (BYTE *)((long)puVar16 + (lVar34 - uVar27));
            local_48 = uVar27 | 4;
            pUVar7[uVar31] = iVar28 - iVar39;
            iVar28 = 6;
            local_80 = &DAT_00000001;
          }
          puVar23 = puVar2;
          puVar16 = puVar12;
          if (iVar28 != 0) break;
          puVar19 = puVar36;
          if (puVar21 <= puVar23) goto LAB_0078ede5;
        }
        if (iVar28 == 6) {
          local_110 = (ulong)local_fc;
          local_c8 = puVar18;
        }
        else {
          if (iVar28 != 7) {
            return (size_t)puVar19;
          }
          local_88 = pBVar8 + uVar25;
          uVar15 = (int)puVar38 - (int)local_88;
          local_c8 = (ulong *)(ulong)uVar15;
          if (uVar15 == 0) goto LAB_00790864;
          local_80 = (BYTE *)(ulong)(uVar15 + 3);
          local_48 = 4;
          local_110 = (ulong)puVar18;
          if ((uVar20 < (uint)uVar25) && (local_90 < puVar38)) {
            pBVar9 = pBVar8 + (uVar25 - 1);
            puVar18 = puVar38;
            while (local_88 = pBVar9, puVar38 = (ulong *)((long)puVar18 + -1),
                  *(BYTE *)puVar38 == *local_88) {
              local_48 = local_48 + 1;
              if ((puVar38 <= local_90) ||
                 (pBVar9 = local_88 + -1, puVar18 = puVar38, local_88 <= pBVar30))
              goto LAB_0078d8ce;
            }
            local_88 = local_88 + 1;
            puVar38 = puVar18;
          }
        }
LAB_0078d8ce:
        puVar18 = (ulong *)((long)puVar38 + local_48);
        puVar16 = (ulong *)(local_88 + local_48);
        puVar23 = puVar18;
        if (puVar18 < puVar5) {
          uVar26 = *puVar18 ^ *puVar16;
          uVar35 = 0;
          if (uVar26 != 0) {
            for (; (uVar26 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
            }
          }
          uVar35 = uVar35 >> 3 & 0x1fffffff;
          if (*puVar16 == *puVar18) {
            do {
              puVar23 = puVar23 + 1;
              puVar16 = puVar16 + 1;
              if (puVar5 <= puVar23) goto LAB_0078d941;
              uVar26 = *puVar23 ^ *puVar16;
              uVar35 = 0;
              if (uVar26 != 0) {
                for (; (uVar26 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                }
              }
              uVar35 = (long)puVar23 + ((uVar35 >> 3 & 0x1fffffff) - (long)puVar18);
            } while (*puVar16 == *puVar23);
          }
        }
        else {
LAB_0078d941:
          if ((puVar23 < (ulong *)((long)puVar1 - 3U)) && ((uint)*puVar16 == (uint)*puVar23)) {
            puVar23 = (ulong *)((long)puVar23 + 4);
            puVar16 = (ulong *)((long)puVar16 + 4);
          }
          if ((puVar23 < (ulong *)((long)puVar1 - 1U)) && ((short)*puVar16 == (short)*puVar23)) {
            puVar23 = (ulong *)((long)puVar23 + 2);
            puVar16 = (ulong *)((long)puVar16 + 2);
          }
          if (puVar23 < puVar1) {
            puVar23 = (ulong *)((long)puVar23 + (ulong)((char)*puVar16 == (char)*puVar23));
          }
          uVar35 = (long)puVar23 - (long)puVar18;
        }
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
        goto LAB_0079076c;
        if (0x20000 < seqStore->maxNbLit) goto LAB_007907aa;
        uVar26 = (long)puVar38 - (long)local_90;
        puVar18 = (ulong *)seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar18 + uVar26))
        goto LAB_0079078b;
        if (puVar1 < puVar38) goto LAB_0079074d;
        if (puVar17 < puVar38) {
          ZSTD_safecopyLiterals((BYTE *)puVar18,(BYTE *)local_90,(BYTE *)puVar38,(BYTE *)puVar17);
        }
        else {
          uVar31 = local_90[1];
          *puVar18 = *local_90;
          puVar18[1] = uVar31;
          if (0x10 < uVar26) {
            pBVar9 = seqStore->lit;
            if (0xffffffffffffffe0 < (ulong)((long)(pBVar9 + 0x10) + (-0x10 - (long)(local_90 + 2)))
               ) goto LAB_007908a2;
            uVar31 = local_90[3];
            *(ulong *)(pBVar9 + 0x10) = local_90[2];
            *(ulong *)(pBVar9 + 0x18) = uVar31;
            if (0x20 < (long)uVar26) {
              lVar34 = 0;
              do {
                puVar6 = (undefined8 *)((long)local_90 + lVar34 + 0x20);
                uVar11 = puVar6[1];
                pBVar3 = pBVar9 + lVar34 + 0x20;
                *(undefined8 *)pBVar3 = *puVar6;
                *(undefined8 *)(pBVar3 + 8) = uVar11;
                puVar6 = (undefined8 *)((long)local_90 + lVar34 + 0x30);
                uVar11 = puVar6[1];
                *(undefined8 *)(pBVar3 + 0x10) = *puVar6;
                *(undefined8 *)(pBVar3 + 0x18) = uVar11;
                lVar34 = lVar34 + 0x20;
              } while (pBVar3 + 0x20 < pBVar9 + uVar26);
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar26;
        if (0xffff < uVar26) {
          if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00790845;
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
        local_48 = uVar35 + local_48;
        psVar10 = seqStore->sequences;
        psVar10->litLength = (U16)uVar26;
        psVar10->offBase = (U32)local_80;
        if (local_48 < 3) goto LAB_007907c9;
        if (0xffff < local_48 - 3) {
          if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_007907e8;
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar10 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar10->mlBase = (U16)(local_48 - 3);
        seqStore->sequences = psVar10 + 1;
        local_90 = (ulong *)((long)puVar38 + local_48);
        local_fc = (uint)local_110;
        if (local_90 <= puVar21) {
          if (pBVar8 + (ulong)uVar41 + 2 <= src) goto LAB_00790883;
          pUVar7[(ulong)(*(long *)(pBVar8 + (ulong)uVar41 + 2) * -0x30e4432340650000) >>
                 (bVar13 & 0x3f)] = uVar41 + 2;
          pUVar7[(ulong)(*(long *)((long)local_90 + -2) * -0x30e4432340650000) >> (bVar13 & 0x3f)] =
               ((int)local_90 + -2) - iVar39;
          if ((uint)local_110 == 0) {
            local_fc = 0;
          }
          else {
            do {
              uVar15 = (uint)local_c8;
              uVar35 = (ulong)(uint)local_110;
              local_fc = (uint)local_110;
              if ((uint)*local_90 != *(uint *)((long)local_90 - uVar35)) break;
              puVar38 = (ulong *)((long)local_90 + 4);
              puVar16 = (ulong *)((long)local_90 + (4 - uVar35));
              puVar18 = puVar38;
              if (puVar38 < puVar5) {
                uVar31 = *puVar38 ^ *puVar16;
                uVar26 = 0;
                if (uVar31 != 0) {
                  for (; (uVar31 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                  }
                }
                uVar26 = uVar26 >> 3 & 0x1fffffff;
                if (*puVar16 == *puVar38) {
                  puVar18 = (ulong *)((long)local_90 + 0xc);
                  puVar16 = (ulong *)((long)local_90 + (0xc - uVar35));
                  do {
                    if (puVar5 <= puVar18) goto LAB_0078dc09;
                    uVar35 = *puVar16;
                    uVar31 = *puVar18;
                    uVar25 = uVar31 ^ uVar35;
                    uVar26 = 0;
                    if (uVar25 != 0) {
                      for (; (uVar25 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                      }
                    }
                    uVar26 = (long)puVar18 + ((uVar26 >> 3 & 0x1fffffff) - (long)puVar38);
                    puVar18 = puVar18 + 1;
                    puVar16 = puVar16 + 1;
                  } while (uVar35 == uVar31);
                }
              }
              else {
LAB_0078dc09:
                if ((puVar18 < (ulong *)((long)puVar1 - 3U)) && ((uint)*puVar16 == (uint)*puVar18))
                {
                  puVar18 = (ulong *)((long)puVar18 + 4);
                  puVar16 = (ulong *)((long)puVar16 + 4);
                }
                if ((puVar18 < (ulong *)((long)puVar1 - 1U)) && ((short)*puVar16 == (short)*puVar18)
                   ) {
                  puVar18 = (ulong *)((long)puVar18 + 2);
                  puVar16 = (ulong *)((long)puVar16 + 2);
                }
                if (puVar18 < puVar1) {
                  puVar18 = (ulong *)((long)puVar18 + (ulong)((char)*puVar16 == (char)*puVar18));
                }
                uVar26 = (long)puVar18 - (long)puVar38;
              }
              pUVar7[*local_90 * -0x30e4432340650000 >> (bVar13 & 0x3f)] = (int)local_90 - iVar39;
              if (seqStore->maxNbSeq <=
                  (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
              goto LAB_0079076c;
              if (0x20000 < seqStore->maxNbLit) goto LAB_007907aa;
              puVar38 = (ulong *)seqStore->lit;
              if (seqStore->litStart + seqStore->maxNbLit < puVar38) goto LAB_0079078b;
              if (puVar1 < local_90) goto LAB_0079074d;
              if (puVar17 < local_90) {
                ZSTD_safecopyLiterals
                          ((BYTE *)puVar38,(BYTE *)local_90,(BYTE *)local_90,(BYTE *)puVar17);
              }
              else {
                uVar35 = local_90[1];
                *puVar38 = *local_90;
                puVar38[1] = uVar35;
              }
              psVar10 = seqStore->sequences;
              psVar10->litLength = 0;
              psVar10->offBase = 1;
              if (uVar26 + 4 < 3) goto LAB_007907c9;
              if (0xffff < uVar26 + 1) {
                if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_007907e8;
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar10 - (long)seqStore->sequencesStart) >> 3);
              }
              local_90 = (ulong *)((long)local_90 + uVar26 + 4);
              psVar10->mlBase = (U16)(uVar26 + 1);
              seqStore->sequences = psVar10 + 1;
              local_c8 = (ulong *)(ulong)(uint)local_110;
              local_fc = uVar15;
              local_110._0_4_ = uVar15;
            } while (local_90 <= puVar21);
          }
        }
        puVar16 = (ulong *)((long)local_90 + uVar32);
        puVar23 = (ulong *)((long)local_90 + uVar32 + 1);
        uVar42 = (uint)local_c8;
        puVar18 = local_c8;
        puVar38 = local_90;
      } while (puVar23 < puVar21);
    }
  }
LAB_0078ede5:
  if (uVar42 != 0) {
    uVar24 = uVar42;
    uVar29 = uVar37;
  }
  if (uVar37 <= uVar22) {
    uVar29 = uVar14;
  }
  *rep = uVar24;
  if (local_fc != 0) {
    uVar29 = local_fc;
  }
LAB_007906e1:
  rep[1] = uVar29;
  return (long)puVar1 - (long)local_90;
}

Assistant:

size_t ZSTD_compressBlock_fast(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    U32 const mls = ms->cParams.minMatch;
    assert(ms->dictMatchState == NULL);
    if (ms->cParams.targetLength > 1) {
        switch(mls)
        {
        default: /* includes case 3 */
        case 4 :
            return ZSTD_compressBlock_fast_noDict_4_1(ms, seqStore, rep, src, srcSize);
        case 5 :
            return ZSTD_compressBlock_fast_noDict_5_1(ms, seqStore, rep, src, srcSize);
        case 6 :
            return ZSTD_compressBlock_fast_noDict_6_1(ms, seqStore, rep, src, srcSize);
        case 7 :
            return ZSTD_compressBlock_fast_noDict_7_1(ms, seqStore, rep, src, srcSize);
        }
    } else {
        switch(mls)
        {
        default: /* includes case 3 */
        case 4 :
            return ZSTD_compressBlock_fast_noDict_4_0(ms, seqStore, rep, src, srcSize);
        case 5 :
            return ZSTD_compressBlock_fast_noDict_5_0(ms, seqStore, rep, src, srcSize);
        case 6 :
            return ZSTD_compressBlock_fast_noDict_6_0(ms, seqStore, rep, src, srcSize);
        case 7 :
            return ZSTD_compressBlock_fast_noDict_7_0(ms, seqStore, rep, src, srcSize);
        }

    }
}